

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# DGRSubgraphMining.cpp
# Opt level: O3

set<dgrminer::children_candidate,_std::less<dgrminer::children_candidate>,_std::allocator<dgrminer::children_candidate>_>
* dgrminer::enumerate(set<dgrminer::children_candidate,_std::less<dgrminer::children_candidate>,_std::allocator<dgrminer::children_candidate>_>
                      *__return_storage_ptr__,
                     vector<dgrminer::AdjacencyListCrate,_std::allocator<dgrminer::AdjacencyListCrate>_>
                     *adjacency_lists,vector<int,_std::allocator<int>_> *graph_ids,
                     vector<std::array<int,_10UL>,_std::allocator<std::array<int,_10UL>_>_>
                     *pattern_edge_list,
                     vector<std::set<int,_std::less<int>,_std::allocator<int>_>,_std::allocator<std::set<int,_std::less<int>,_std::allocator<int>_>_>_>
                     *nodes_occupied_by_antecedent,
                     vector<std::set<int,_std::less<int>,_std::allocator<int>_>,_std::allocator<std::set<int,_std::less<int>,_std::allocator<int>_>_>_>
                     *edges_occupied_by_antecedent,bool new_measures,
                     unordered_map<int,_std::set<std::set<int,_std::less<int>,_std::allocator<int>_>,_std::less<std::set<int,_std::less<int>,_std::allocator<int>_>_>,_std::allocator<std::set<int,_std::less<int>,_std::allocator<int>_>_>_>,_std::hash<int>,_std::equal_to<int>,_std::allocator<std::pair<const_int,_std::set<std::set<int,_std::less<int>,_std::allocator<int>_>,_std::less<std::set<int,_std::less<int>,_std::allocator<int>_>_>,_std::allocator<std::set<int,_std::less<int>,_std::allocator<int>_>_>_>_>_>_>
                     *multiple_pattern_occurrences,
                     unordered_map<int,_std::set<std::set<int,_std::less<int>,_std::allocator<int>_>,_std::less<std::set<int,_std::less<int>,_std::allocator<int>_>_>,_std::allocator<std::set<int,_std::less<int>,_std::allocator<int>_>_>_>,_std::hash<int>,_std::equal_to<int>,_std::allocator<std::pair<const_int,_std::set<std::set<int,_std::less<int>,_std::allocator<int>_>,_std::less<std::set<int,_std::less<int>,_std::allocator<int>_>_>,_std::allocator<std::set<int,_std::less<int>,_std::allocator<int>_>_>_>_>_>_>
                     *multiple_antecedent_occurrences)

{
  _Rb_tree_header *p_Var1;
  ulong *puVar2;
  int iVar3;
  int iVar4;
  int *piVar5;
  bool bVar6;
  int *piVar7;
  ulong uVar8;
  pointer paVar9;
  pointer paVar10;
  _Rb_tree<std::set<int,std::less<int>,std::allocator<int>>,std::set<int,std::less<int>,std::allocator<int>>,std::_Identity<std::set<int,std::less<int>,std::allocator<int>>>,std::less<std::set<int,std::less<int>,std::allocator<int>>>,std::allocator<std::set<int,std::less<int>,std::allocator<int>>>>
  *p_Var11;
  iterator iVar12;
  _Elt_pointer piVar13;
  pointer piVar14;
  pointer pvVar15;
  int iVar16;
  long lVar17;
  pointer paVar18;
  _Elt_pointer piVar19;
  vector<int,_std::allocator<int>_> *pvVar20;
  pointer pvVar21;
  ulong uVar22;
  void *pvVar23;
  int *piVar24;
  long lVar25;
  ulong uVar26;
  size_t i;
  ulong uVar27;
  int iVar28;
  ulong uVar29;
  ulong uVar30;
  vector<std::array<int,_10UL>,_std::allocator<std::array<int,_10UL>_>_> *pvVar31;
  long lVar32;
  long lVar33;
  bool bVar34;
  int g_id;
  int local_32c;
  ulong local_328;
  vector<std::array<int,_10UL>,_std::allocator<std::array<int,_10UL>_>_> *local_320;
  int local_314;
  long local_310;
  vector<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
  adj_list;
  vector<int,_std::allocator<int>_> real_ids_dst;
  vector<int,_std::allocator<int>_> real_ids_src;
  int n_1;
  int iStack_294;
  _Rb_tree_node_base _Stack_290;
  _Rb_tree<int,_int,_std::_Identity<int>,_std::less<int>,_std::allocator<int>_> local_270;
  _Hashtable<int,_std::pair<const_int,_std::set<std::set<int,_std::less<int>,_std::allocator<int>_>,_std::less<std::set<int,_std::less<int>,_std::allocator<int>_>_>,_std::allocator<std::set<int,_std::less<int>,_std::allocator<int>_>_>_>_>,_std::allocator<std::pair<const_int,_std::set<std::set<int,_std::less<int>,_std::allocator<int>_>,_std::less<std::set<int,_std::less<int>,_std::allocator<int>_>_>,_std::allocator<std::set<int,_std::less<int>,_std::allocator<int>_>_>_>_>_>,_std::__detail::_Select1st,_std::equal_to<int>,_std::hash<int>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>_>
  local_240;
  vector<int,_std::allocator<int>_> real_ids_dst_ind;
  vector<int,_std::allocator<int>_> right_most_path_occurrence;
  vector<std::vector<std::array<int,_8UL>,_std::allocator<std::array<int,_8UL>_>_>,_std::allocator<std::vector<std::array<int,_8UL>,_std::allocator<std::array<int,_8UL>_>_>_>_>
  adj_edge_info;
  vector<int,_std::allocator<int>_> real_ids_src_ind;
  vector<int,_std::allocator<int>_> sequence_of_edge_indices;
  set<int,_std::less<int>,_std::allocator<int>_> pattern_occurrence_vertexes;
  size_type local_138;
  deque<int,_std::allocator<int>_> right_most_path;
  vector<int,_std::allocator<int>_> sequence_of_nodes;
  vector<std::array<int,_8UL>,_std::allocator<std::array<int,_8UL>_>_> edge_candidates_1;
  vector<int,_std::allocator<int>_> real_second_edge_ids;
  int n_1_1;
  undefined4 uStack_5c;
  void *local_58;
  
  p_Var1 = &(__return_storage_ptr__->_M_t)._M_impl.super__Rb_tree_header;
  (__return_storage_ptr__->_M_t)._M_impl.super__Rb_tree_header._M_header._M_color = _S_red;
  (__return_storage_ptr__->_M_t)._M_impl.super__Rb_tree_header._M_header._M_parent = (_Base_ptr)0x0;
  (__return_storage_ptr__->_M_t)._M_impl.super__Rb_tree_header._M_header._M_left =
       &p_Var1->_M_header;
  (__return_storage_ptr__->_M_t)._M_impl.super__Rb_tree_header._M_header._M_right =
       &p_Var1->_M_header;
  (__return_storage_ptr__->_M_t)._M_impl.super__Rb_tree_header._M_node_count = 0;
  find_rightmost_path(&right_most_path,pattern_edge_list);
  paVar10 = (pattern_edge_list->
            super__Vector_base<std::array<int,_10UL>,_std::allocator<std::array<int,_10UL>_>_>).
            _M_impl.super__Vector_impl_data._M_start;
  lVar17 = (long)(pattern_edge_list->
                 super__Vector_base<std::array<int,_10UL>,_std::allocator<std::array<int,_10UL>_>_>)
                 ._M_impl.super__Vector_impl_data._M_finish - (long)paVar10;
  if (lVar17 == 0) {
    local_138 = 1;
  }
  else {
    lVar17 = (lVar17 >> 3) * -0x3333333333333333;
    lVar17 = lVar17 + (ulong)(lVar17 == 0);
    piVar7 = paVar10->_M_elems + 1;
    iVar16 = 0;
    do {
      iVar28 = *piVar7;
      if (*piVar7 < iVar16) {
        iVar28 = iVar16;
      }
      iVar16 = iVar28;
      piVar7 = piVar7 + 10;
      lVar17 = lVar17 + -1;
    } while (lVar17 != 0);
    local_138 = (size_type)(iVar16 + 1);
  }
  local_320 = pattern_edge_list;
  if ((adjacency_lists->
      super__Vector_base<dgrminer::AdjacencyListCrate,_std::allocator<dgrminer::AdjacencyListCrate>_>
      )._M_impl.super__Vector_impl_data._M_finish !=
      (adjacency_lists->
      super__Vector_base<dgrminer::AdjacencyListCrate,_std::allocator<dgrminer::AdjacencyListCrate>_>
      )._M_impl.super__Vector_impl_data._M_start) {
    uVar30 = 0;
    do {
      _n_1 = 0;
      _Stack_290._M_color = _S_red;
      _Stack_290._4_4_ = 0;
      _Stack_290._M_parent = (_Base_ptr)0x0;
      local_270._M_impl._0_8_ = 0;
      _Stack_290._M_left = &_Stack_290;
      _Stack_290._M_right = &_Stack_290;
      std::
      vector<std::set<int,std::less<int>,std::allocator<int>>,std::allocator<std::set<int,std::less<int>,std::allocator<int>>>>
      ::emplace_back<std::set<int,std::less<int>,std::allocator<int>>>
                ((vector<std::set<int,std::less<int>,std::allocator<int>>,std::allocator<std::set<int,std::less<int>,std::allocator<int>>>>
                  *)nodes_occupied_by_antecedent,
                 (set<int,_std::less<int>,_std::allocator<int>_> *)&n_1);
      std::_Rb_tree<int,_int,_std::_Identity<int>,_std::less<int>,_std::allocator<int>_>::~_Rb_tree
                ((_Rb_tree<int,_int,_std::_Identity<int>,_std::less<int>,_std::allocator<int>_> *)
                 &n_1);
      _Stack_290._M_parent = (_Base_ptr)0x0;
      _n_1 = 0;
      _Stack_290._0_8_ = 0;
      local_270._M_impl._0_8_ = 0;
      _Stack_290._M_left = &_Stack_290;
      _Stack_290._M_right = &_Stack_290;
      std::
      vector<std::set<int,std::less<int>,std::allocator<int>>,std::allocator<std::set<int,std::less<int>,std::allocator<int>>>>
      ::emplace_back<std::set<int,std::less<int>,std::allocator<int>>>
                ((vector<std::set<int,std::less<int>,std::allocator<int>>,std::allocator<std::set<int,std::less<int>,std::allocator<int>>>>
                  *)edges_occupied_by_antecedent,
                 (set<int,_std::less<int>,_std::allocator<int>_> *)&n_1);
      std::_Rb_tree<int,_int,_std::_Identity<int>,_std::less<int>,_std::allocator<int>_>::~_Rb_tree
                ((_Rb_tree<int,_int,_std::_Identity<int>,_std::less<int>,_std::allocator<int>_> *)
                 &n_1);
      uVar30 = uVar30 + 1;
      uVar8 = ((long)(adjacency_lists->
                     super__Vector_base<dgrminer::AdjacencyListCrate,_std::allocator<dgrminer::AdjacencyListCrate>_>
                     )._M_impl.super__Vector_impl_data._M_finish -
               (long)(adjacency_lists->
                     super__Vector_base<dgrminer::AdjacencyListCrate,_std::allocator<dgrminer::AdjacencyListCrate>_>
                     )._M_impl.super__Vector_impl_data._M_start >> 3) * -0x71c71c71c71c71c7;
    } while (uVar30 <= uVar8 && uVar8 - uVar30 != 0);
  }
  piVar7 = (graph_ids->super__Vector_base<int,_std::allocator<int>_>)._M_impl.
           super__Vector_impl_data._M_start;
  piVar5 = (graph_ids->super__Vector_base<int,_std::allocator<int>_>)._M_impl.
           super__Vector_impl_data._M_finish;
  if (piVar7 != piVar5) {
    pvVar31 = local_320;
    do {
      g_id = *piVar7;
      std::
      vector<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
      ::vector(&adj_list,
               &(adjacency_lists->
                super__Vector_base<dgrminer::AdjacencyListCrate,_std::allocator<dgrminer::AdjacencyListCrate>_>
                )._M_impl.super__Vector_impl_data._M_start[g_id].adjacencyList);
      std::
      vector<std::vector<std::array<int,_8UL>,_std::allocator<std::array<int,_8UL>_>_>,_std::allocator<std::vector<std::array<int,_8UL>,_std::allocator<std::array<int,_8UL>_>_>_>_>
      ::vector(&adj_edge_info,
               &(adjacency_lists->
                super__Vector_base<dgrminer::AdjacencyListCrate,_std::allocator<dgrminer::AdjacencyListCrate>_>
                )._M_impl.super__Vector_impl_data._M_start[g_id].adjacencyEdgeInfo);
      _n_1 = _n_1 & 0xffffffff00000000;
      std::vector<int,_std::allocator<int>_>::vector
                (&real_ids_src,
                 ((long)(pvVar31->
                        super__Vector_base<std::array<int,_10UL>,_std::allocator<std::array<int,_10UL>_>_>
                        )._M_impl.super__Vector_impl_data._M_finish -
                  (long)(pvVar31->
                        super__Vector_base<std::array<int,_10UL>,_std::allocator<std::array<int,_10UL>_>_>
                        )._M_impl.super__Vector_impl_data._M_start >> 3) * -0x3333333333333333,&n_1,
                 (allocator_type *)&pattern_occurrence_vertexes);
      _n_1 = _n_1 & 0xffffffff00000000;
      std::vector<int,_std::allocator<int>_>::vector
                (&real_ids_dst,
                 ((long)(pvVar31->
                        super__Vector_base<std::array<int,_10UL>,_std::allocator<std::array<int,_10UL>_>_>
                        )._M_impl.super__Vector_impl_data._M_finish -
                  (long)(pvVar31->
                        super__Vector_base<std::array<int,_10UL>,_std::allocator<std::array<int,_10UL>_>_>
                        )._M_impl.super__Vector_impl_data._M_start >> 3) * -0x3333333333333333,&n_1,
                 (allocator_type *)&pattern_occurrence_vertexes);
      _n_1 = _n_1 & 0xffffffff00000000;
      std::vector<int,_std::allocator<int>_>::vector
                (&real_ids_dst_ind,
                 ((long)(pvVar31->
                        super__Vector_base<std::array<int,_10UL>,_std::allocator<std::array<int,_10UL>_>_>
                        )._M_impl.super__Vector_impl_data._M_finish -
                  (long)(pvVar31->
                        super__Vector_base<std::array<int,_10UL>,_std::allocator<std::array<int,_10UL>_>_>
                        )._M_impl.super__Vector_impl_data._M_start >> 3) * -0x3333333333333333,&n_1,
                 (allocator_type *)&pattern_occurrence_vertexes);
      _n_1 = _n_1 & 0xffffffff00000000;
      std::vector<int,_std::allocator<int>_>::vector
                (&real_ids_src_ind,
                 ((long)(pvVar31->
                        super__Vector_base<std::array<int,_10UL>,_std::allocator<std::array<int,_10UL>_>_>
                        )._M_impl.super__Vector_impl_data._M_finish -
                  (long)(pvVar31->
                        super__Vector_base<std::array<int,_10UL>,_std::allocator<std::array<int,_10UL>_>_>
                        )._M_impl.super__Vector_impl_data._M_start >> 3) * -0x3333333333333333,&n_1,
                 (allocator_type *)&pattern_occurrence_vertexes);
      if (adj_list.
          super__Vector_base<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
          ._M_impl.super__Vector_impl_data._M_finish !=
          adj_list.
          super__Vector_base<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
          ._M_impl.super__Vector_impl_data._M_start) {
        uVar30 = 0;
        pvVar15 = adj_list.
                  super__Vector_base<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
                  ._M_impl.super__Vector_impl_data._M_finish;
        pvVar21 = adj_list.
                  super__Vector_base<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
                  ._M_impl.super__Vector_impl_data._M_start;
        do {
          if (pvVar21[uVar30].super__Vector_base<int,_std::allocator<int>_>._M_impl.
              super__Vector_impl_data._M_finish !=
              pvVar21[uVar30].super__Vector_base<int,_std::allocator<int>_>._M_impl.
              super__Vector_impl_data._M_start) {
            uVar8 = 0;
            do {
              bVar6 = is_adj_info_equal_to_pattern_edge
                                (adj_edge_info.
                                 super__Vector_base<std::vector<std::array<int,_8UL>,_std::allocator<std::array<int,_8UL>_>_>,_std::allocator<std::vector<std::array<int,_8UL>,_std::allocator<std::array<int,_8UL>_>_>_>_>
                                 ._M_impl.super__Vector_impl_data._M_start[uVar30].
                                 super__Vector_base<std::array<int,_8UL>,_std::allocator<std::array<int,_8UL>_>_>
                                 ._M_impl.super__Vector_impl_data._M_start + uVar8,
                                 (local_320->
                                 super__Vector_base<std::array<int,_10UL>,_std::allocator<std::array<int,_10UL>_>_>
                                 )._M_impl.super__Vector_impl_data._M_start,true);
              if (bVar6) {
                *real_ids_src.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                 super__Vector_impl_data._M_start = (int)uVar30;
                *real_ids_dst.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                 super__Vector_impl_data._M_start =
                     adj_list.
                     super__Vector_base<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
                     ._M_impl.super__Vector_impl_data._M_start[uVar30].
                     super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
                     _M_start[uVar8];
                *real_ids_dst_ind.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                 super__Vector_impl_data._M_start = (int)uVar8;
                lVar17 = (long)*real_ids_dst.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                                super__Vector_impl_data._M_start;
                piVar14 = adj_list.
                          super__Vector_base<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
                          ._M_impl.super__Vector_impl_data._M_start[lVar17].
                          super__Vector_base<int,_std::allocator<int>_>._M_impl.
                          super__Vector_impl_data._M_start;
                if (adj_list.
                    super__Vector_base<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
                    ._M_impl.super__Vector_impl_data._M_start[lVar17].
                    super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
                    _M_finish != piVar14) {
                  lVar32 = 0;
                  uVar27 = 0;
                  piVar24 = real_ids_dst.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                            super__Vector_impl_data._M_start;
                  pvVar15 = adj_list.
                            super__Vector_base<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
                            ._M_impl.super__Vector_impl_data._M_start;
                  do {
                    if (uVar30 == (long)piVar14[uVar27]) {
                      flipAdjacencyInfo((array<int,_8UL> *)
                                        ((long)(adj_edge_info.
                                                super__Vector_base<std::vector<std::array<int,_8UL>,_std::allocator<std::array<int,_8UL>_>_>,_std::allocator<std::vector<std::array<int,_8UL>,_std::allocator<std::array<int,_8UL>_>_>_>_>
                                                ._M_impl.super__Vector_impl_data._M_start
                                                [(int)lVar17].
                                                super__Vector_base<std::array<int,_8UL>,_std::allocator<std::array<int,_8UL>_>_>
                                                ._M_impl.super__Vector_impl_data._M_start)->_M_elems
                                        + lVar32));
                      bVar6 = is_adj_info_equal_to_pattern_edge
                                        ((array<int,_8UL> *)&n_1,
                                         (local_320->
                                         super__Vector_base<std::array<int,_10UL>,_std::allocator<std::array<int,_10UL>_>_>
                                         )._M_impl.super__Vector_impl_data._M_start,true);
                      piVar24 = real_ids_dst.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                                super__Vector_impl_data._M_start;
                      pvVar15 = adj_list.
                                super__Vector_base<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
                                ._M_impl.super__Vector_impl_data._M_start;
                      if (bVar6) {
                        *real_ids_src_ind.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                         super__Vector_impl_data._M_start = (int)uVar27;
                        break;
                      }
                    }
                    uVar27 = uVar27 + 1;
                    lVar17 = (long)*piVar24;
                    piVar14 = pvVar15[lVar17].super__Vector_base<int,_std::allocator<int>_>._M_impl.
                              super__Vector_impl_data._M_start;
                    lVar32 = lVar32 + 0x20;
                  } while (uVar27 < (ulong)((long)pvVar15[lVar17].
                                                  super__Vector_base<int,_std::allocator<int>_>.
                                                  _M_impl.super__Vector_impl_data._M_finish -
                                            (long)piVar14 >> 2));
                }
                _n_1 = _n_1 & 0xffffffff00000000;
                std::vector<int,_std::allocator<int>_>::vector
                          (&sequence_of_nodes,local_138,&n_1,
                           (allocator_type *)&pattern_occurrence_vertexes);
                *sequence_of_nodes.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                 super__Vector_impl_data._M_start = (int)uVar30;
                sequence_of_nodes.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                super__Vector_impl_data._M_start[1] =
                     adj_list.
                     super__Vector_base<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
                     ._M_impl.super__Vector_impl_data._M_start[uVar30].
                     super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
                     _M_start[uVar8];
                _n_1 = _n_1 & 0xffffffff00000000;
                std::vector<int,_std::allocator<int>_>::vector
                          (&sequence_of_edge_indices,
                           ((long)(local_320->
                                  super__Vector_base<std::array<int,_10UL>,_std::allocator<std::array<int,_10UL>_>_>
                                  )._M_impl.super__Vector_impl_data._M_finish -
                            (long)(local_320->
                                  super__Vector_base<std::array<int,_10UL>,_std::allocator<std::array<int,_10UL>_>_>
                                  )._M_impl.super__Vector_impl_data._M_start >> 3) *
                           -0x3333333333333333,&n_1,(allocator_type *)&pattern_occurrence_vertexes);
                *sequence_of_edge_indices.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                 super__Vector_impl_data._M_start = (int)uVar8;
                iVar16 = 1;
LAB_00140f63:
                uVar22 = (ulong)iVar16;
                paVar10 = (local_320->
                          super__Vector_base<std::array<int,_10UL>,_std::allocator<std::array<int,_10UL>_>_>
                          )._M_impl.super__Vector_impl_data._M_start;
                paVar9 = (local_320->
                         super__Vector_base<std::array<int,_10UL>,_std::allocator<std::array<int,_10UL>_>_>
                         )._M_impl.super__Vector_impl_data._M_finish;
                uVar27 = ((long)paVar9 - (long)paVar10 >> 3) * -0x3333333333333333;
                local_314 = iVar16;
                if (uVar27 < uVar22 || uVar27 - uVar22 == 0) {
                  paVar18 = paVar9;
                  local_328 = uVar22;
                  if (paVar9 != paVar10) {
                    lVar17 = 0;
                    uVar27 = 0;
                    do {
                      _n_1 = CONCAT44(iStack_294,
                                      *(undefined4 *)
                                       ((long)real_ids_src.
                                              super__Vector_base<int,_std::allocator<int>_>._M_impl.
                                              super__Vector_impl_data._M_start + lVar17));
                      iVar16 = *(int *)((long)real_ids_dst_ind.
                                              super__Vector_base<int,_std::allocator<int>_>._M_impl.
                                              super__Vector_impl_data._M_start + lVar17);
                      std::_Rb_tree<int,int,std::_Identity<int>,std::less<int>,std::allocator<int>>
                      ::_M_insert_unique<int_const&>
                                ((_Rb_tree<int,int,std::_Identity<int>,std::less<int>,std::allocator<int>>
                                  *)((nodes_occupied_by_antecedent->
                                     super__Vector_base<std::set<int,_std::less<int>,_std::allocator<int>_>,_std::allocator<std::set<int,_std::less<int>,_std::allocator<int>_>_>_>
                                     )._M_impl.super__Vector_impl_data._M_start + g_id),&n_1);
                      std::_Rb_tree<int,int,std::_Identity<int>,std::less<int>,std::allocator<int>>
                      ::_M_insert_unique<int_const&>
                                ((_Rb_tree<int,int,std::_Identity<int>,std::less<int>,std::allocator<int>>
                                  *)((nodes_occupied_by_antecedent->
                                     super__Vector_base<std::set<int,_std::less<int>,_std::allocator<int>_>,_std::allocator<std::set<int,_std::less<int>,_std::allocator<int>_>_>_>
                                     )._M_impl.super__Vector_impl_data._M_start + g_id),
                                 (int *)((long)real_ids_dst.
                                               super__Vector_base<int,_std::allocator<int>_>._M_impl
                                               .super__Vector_impl_data._M_start + lVar17));
                      std::_Rb_tree<int,int,std::_Identity<int>,std::less<int>,std::allocator<int>>
                      ::_M_insert_unique<int_const&>
                                ((_Rb_tree<int,int,std::_Identity<int>,std::less<int>,std::allocator<int>>
                                  *)((edges_occupied_by_antecedent->
                                     super__Vector_base<std::set<int,_std::less<int>,_std::allocator<int>_>,_std::allocator<std::set<int,_std::less<int>,_std::allocator<int>_>_>_>
                                     )._M_impl.super__Vector_impl_data._M_start + g_id),
                                 adj_edge_info.
                                 super__Vector_base<std::vector<std::array<int,_8UL>,_std::allocator<std::array<int,_8UL>_>_>,_std::allocator<std::vector<std::array<int,_8UL>,_std::allocator<std::array<int,_8UL>_>_>_>_>
                                 ._M_impl.super__Vector_impl_data._M_start[n_1].
                                 super__Vector_base<std::array<int,_8UL>,_std::allocator<std::array<int,_8UL>_>_>
                                 ._M_impl.super__Vector_impl_data._M_start[iVar16]._M_elems + 7);
                      uVar27 = uVar27 + 1;
                      paVar9 = (local_320->
                               super__Vector_base<std::array<int,_10UL>,_std::allocator<std::array<int,_10UL>_>_>
                               )._M_impl.super__Vector_impl_data._M_start;
                      paVar18 = (local_320->
                                super__Vector_base<std::array<int,_10UL>,_std::allocator<std::array<int,_10UL>_>_>
                                )._M_impl.super__Vector_impl_data._M_finish;
                      uVar22 = ((long)paVar18 - (long)paVar9 >> 3) * -0x3333333333333333;
                      lVar17 = lVar17 + 4;
                    } while (uVar27 <= uVar22 && uVar22 - uVar27 != 0);
                  }
                  pvVar31 = local_320;
                  pattern_occurrence_vertexes._M_t._M_impl.super__Rb_tree_header._M_header._M_color
                       = _S_red;
                  pattern_occurrence_vertexes._M_t._M_impl.super__Rb_tree_header._M_header._M_parent
                       = (_Base_ptr)0x0;
                  pattern_occurrence_vertexes._M_t._M_impl.super__Rb_tree_header._M_header._M_left =
                       &pattern_occurrence_vertexes._M_t._M_impl.super__Rb_tree_header._M_header;
                  pattern_occurrence_vertexes._M_t._M_impl.super__Rb_tree_header._M_node_count = 0;
                  pattern_occurrence_vertexes._M_t._M_impl.super__Rb_tree_header._M_header._M_right
                       = pattern_occurrence_vertexes._M_t._M_impl.super__Rb_tree_header._M_header.
                         _M_left;
                  if (new_measures) {
                    _Stack_290._0_8_ = _Stack_290._0_8_ & 0xffffffff00000000;
                    _Stack_290._M_parent = (_Base_ptr)0x0;
                    _Stack_290._M_left = &_Stack_290;
                    local_270._M_impl._0_8_ = 0;
                    _Stack_290._M_right = _Stack_290._M_left;
                    if (paVar18 != paVar9) {
                      lVar32 = 0;
                      lVar17 = 0;
                      uVar27 = 0;
                      do {
                        n_1_1 = *(int *)((long)real_ids_src.
                                               super__Vector_base<int,_std::allocator<int>_>._M_impl
                                               .super__Vector_impl_data._M_start + lVar32);
                        std::
                        _Rb_tree<int,int,std::_Identity<int>,std::less<int>,std::allocator<int>>::
                        _M_insert_unique<int_const&>
                                  ((_Rb_tree<int,int,std::_Identity<int>,std::less<int>,std::allocator<int>>
                                    *)&pattern_occurrence_vertexes,&n_1_1);
                        std::
                        _Rb_tree<int,int,std::_Identity<int>,std::less<int>,std::allocator<int>>::
                        _M_insert_unique<int_const&>
                                  ((_Rb_tree<int,int,std::_Identity<int>,std::less<int>,std::allocator<int>>
                                    *)&pattern_occurrence_vertexes,
                                   (int *)((long)real_ids_dst.
                                                 super__Vector_base<int,_std::allocator<int>_>.
                                                 _M_impl.super__Vector_impl_data._M_start + lVar32))
                        ;
                        paVar10 = (pvVar31->
                                  super__Vector_base<std::array<int,_10UL>,_std::allocator<std::array<int,_10UL>_>_>
                                  )._M_impl.super__Vector_impl_data._M_start;
                        if (*(int *)((long)paVar10->_M_elems + lVar17 + 0xc) != 0) {
                          std::
                          _Rb_tree<int,int,std::_Identity<int>,std::less<int>,std::allocator<int>>::
                          _M_insert_unique<int_const&>
                                    ((_Rb_tree<int,int,std::_Identity<int>,std::less<int>,std::allocator<int>>
                                      *)&n_1,&n_1_1);
                          paVar10 = (pvVar31->
                                    super__Vector_base<std::array<int,_10UL>,_std::allocator<std::array<int,_10UL>_>_>
                                    )._M_impl.super__Vector_impl_data._M_start;
                        }
                        if (*(int *)((long)paVar10->_M_elems + lVar17 + 0x20) != 0) {
                          std::
                          _Rb_tree<int,int,std::_Identity<int>,std::less<int>,std::allocator<int>>::
                          _M_insert_unique<int_const&>
                                    ((_Rb_tree<int,int,std::_Identity<int>,std::less<int>,std::allocator<int>>
                                      *)&n_1,(int *)((long)real_ids_dst.
                                                                                                                      
                                                  super__Vector_base<int,_std::allocator<int>_>.
                                                  _M_impl.super__Vector_impl_data._M_start + lVar32)
                                    );
                          paVar10 = (pvVar31->
                                    super__Vector_base<std::array<int,_10UL>,_std::allocator<std::array<int,_10UL>_>_>
                                    )._M_impl.super__Vector_impl_data._M_start;
                        }
                        uVar27 = uVar27 + 1;
                        uVar22 = ((long)(pvVar31->
                                        super__Vector_base<std::array<int,_10UL>,_std::allocator<std::array<int,_10UL>_>_>
                                        )._M_impl.super__Vector_impl_data._M_finish - (long)paVar10
                                 >> 3) * -0x3333333333333333;
                        lVar17 = lVar17 + 0x28;
                        lVar32 = lVar32 + 4;
                      } while (uVar27 <= uVar22 && uVar22 - uVar27 != 0);
                    }
                    p_Var11 = (_Rb_tree<std::set<int,std::less<int>,std::allocator<int>>,std::set<int,std::less<int>,std::allocator<int>>,std::_Identity<std::set<int,std::less<int>,std::allocator<int>>>,std::less<std::set<int,std::less<int>,std::allocator<int>>>,std::allocator<std::set<int,std::less<int>,std::allocator<int>>>>
                               *)std::__detail::
                                 _Map_base<int,_std::pair<const_int,_std::set<std::set<int,_std::less<int>,_std::allocator<int>_>,_std::less<std::set<int,_std::less<int>,_std::allocator<int>_>_>,_std::allocator<std::set<int,_std::less<int>,_std::allocator<int>_>_>_>_>,_std::allocator<std::pair<const_int,_std::set<std::set<int,_std::less<int>,_std::allocator<int>_>,_std::less<std::set<int,_std::less<int>,_std::allocator<int>_>_>,_std::allocator<std::set<int,_std::less<int>,_std::allocator<int>_>_>_>_>_>,_std::__detail::_Select1st,_std::equal_to<int>,_std::hash<int>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>,_true>
                                 ::operator[]((_Map_base<int,_std::pair<const_int,_std::set<std::set<int,_std::less<int>,_std::allocator<int>_>,_std::less<std::set<int,_std::less<int>,_std::allocator<int>_>_>,_std::allocator<std::set<int,_std::less<int>,_std::allocator<int>_>_>_>_>,_std::allocator<std::pair<const_int,_std::set<std::set<int,_std::less<int>,_std::allocator<int>_>,_std::less<std::set<int,_std::less<int>,_std::allocator<int>_>_>,_std::allocator<std::set<int,_std::less<int>,_std::allocator<int>_>_>_>_>_>,_std::__detail::_Select1st,_std::equal_to<int>,_std::hash<int>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>,_true>
                                               *)multiple_pattern_occurrences,&g_id);
                    std::
                    _Rb_tree<std::set<int,std::less<int>,std::allocator<int>>,std::set<int,std::less<int>,std::allocator<int>>,std::_Identity<std::set<int,std::less<int>,std::allocator<int>>>,std::less<std::set<int,std::less<int>,std::allocator<int>>>,std::allocator<std::set<int,std::less<int>,std::allocator<int>>>>
                    ::_M_insert_unique<std::set<int,std::less<int>,std::allocator<int>>const&>
                              (p_Var11,&pattern_occurrence_vertexes);
                    p_Var11 = (_Rb_tree<std::set<int,std::less<int>,std::allocator<int>>,std::set<int,std::less<int>,std::allocator<int>>,std::_Identity<std::set<int,std::less<int>,std::allocator<int>>>,std::less<std::set<int,std::less<int>,std::allocator<int>>>,std::allocator<std::set<int,std::less<int>,std::allocator<int>>>>
                               *)std::__detail::
                                 _Map_base<int,_std::pair<const_int,_std::set<std::set<int,_std::less<int>,_std::allocator<int>_>,_std::less<std::set<int,_std::less<int>,_std::allocator<int>_>_>,_std::allocator<std::set<int,_std::less<int>,_std::allocator<int>_>_>_>_>,_std::allocator<std::pair<const_int,_std::set<std::set<int,_std::less<int>,_std::allocator<int>_>,_std::less<std::set<int,_std::less<int>,_std::allocator<int>_>_>,_std::allocator<std::set<int,_std::less<int>,_std::allocator<int>_>_>_>_>_>,_std::__detail::_Select1st,_std::equal_to<int>,_std::hash<int>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>,_true>
                                 ::operator[]((_Map_base<int,_std::pair<const_int,_std::set<std::set<int,_std::less<int>,_std::allocator<int>_>,_std::less<std::set<int,_std::less<int>,_std::allocator<int>_>_>,_std::allocator<std::set<int,_std::less<int>,_std::allocator<int>_>_>_>_>,_std::allocator<std::pair<const_int,_std::set<std::set<int,_std::less<int>,_std::allocator<int>_>,_std::less<std::set<int,_std::less<int>,_std::allocator<int>_>_>,_std::allocator<std::set<int,_std::less<int>,_std::allocator<int>_>_>_>_>_>,_std::__detail::_Select1st,_std::equal_to<int>,_std::hash<int>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>,_true>
                                               *)multiple_antecedent_occurrences,&g_id);
                    std::
                    _Rb_tree<std::set<int,std::less<int>,std::allocator<int>>,std::set<int,std::less<int>,std::allocator<int>>,std::_Identity<std::set<int,std::less<int>,std::allocator<int>>>,std::less<std::set<int,std::less<int>,std::allocator<int>>>,std::allocator<std::set<int,std::less<int>,std::allocator<int>>>>
                    ::_M_insert_unique<std::set<int,std::less<int>,std::allocator<int>>const&>
                              (p_Var11,(set<int,_std::less<int>,_std::allocator<int>_> *)&n_1);
                    std::
                    _Rb_tree<int,_int,_std::_Identity<int>,_std::less<int>,_std::allocator<int>_>::
                    ~_Rb_tree((_Rb_tree<int,_int,_std::_Identity<int>,_std::less<int>,_std::allocator<int>_>
                               *)&n_1);
                  }
                  right_most_path_occurrence.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                  super__Vector_impl_data._M_start = (pointer)0x0;
                  right_most_path_occurrence.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                  super__Vector_impl_data._M_finish = (pointer)0x0;
                  right_most_path_occurrence.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
                  lVar17 = 0;
                  uVar27 = 0;
                  while( true ) {
                    uVar22 = (ulong)((long)right_most_path.
                                           super__Deque_base<int,_std::allocator<int>_>._M_impl.
                                           super__Deque_impl_data._M_finish._M_node -
                                    (long)right_most_path.
                                          super__Deque_base<int,_std::allocator<int>_>._M_impl.
                                          super__Deque_impl_data._M_start._M_node) >> 3;
                    lVar32 = (long)right_most_path.super__Deque_base<int,_std::allocator<int>_>.
                                   _M_impl.super__Deque_impl_data._M_start._M_last -
                             (long)right_most_path.super__Deque_base<int,_std::allocator<int>_>.
                                   _M_impl.super__Deque_impl_data._M_start._M_cur >> 2;
                    uVar26 = ((long)right_most_path.super__Deque_base<int,_std::allocator<int>_>.
                                    _M_impl.super__Deque_impl_data._M_finish._M_cur -
                              (long)right_most_path.super__Deque_base<int,_std::allocator<int>_>.
                                    _M_impl.super__Deque_impl_data._M_finish._M_first >> 2) + lVar32
                             + ((uVar22 - 1) +
                               (ulong)(right_most_path.super__Deque_base<int,_std::allocator<int>_>.
                                       _M_impl.super__Deque_impl_data._M_finish._M_node ==
                                      (_Map_pointer)0x0)) * 0x80;
                    if (uVar26 <= uVar27) break;
                    uVar22 = ((long)right_most_path.super__Deque_base<int,_std::allocator<int>_>.
                                    _M_impl.super__Deque_impl_data._M_start._M_cur -
                              (long)right_most_path.super__Deque_base<int,_std::allocator<int>_>.
                                    _M_impl.super__Deque_impl_data._M_start._M_first >> 2) + uVar27;
                    if ((long)uVar22 < 0) {
                      uVar26 = (long)uVar22 >> 7;
LAB_001412c7:
                      piVar24 = right_most_path.super__Deque_base<int,_std::allocator<int>_>._M_impl
                                .super__Deque_impl_data._M_start._M_node[uVar26] +
                                uVar22 + uVar26 * -0x80;
                    }
                    else {
                      if (0x7f < uVar22) {
                        uVar26 = uVar22 >> 7;
                        goto LAB_001412c7;
                      }
                      piVar24 = (int *)((long)right_most_path.
                                              super__Deque_base<int,_std::allocator<int>_>._M_impl.
                                              super__Deque_impl_data._M_start._M_cur + lVar17);
                    }
                    if (right_most_path_occurrence.super__Vector_base<int,_std::allocator<int>_>.
                        _M_impl.super__Vector_impl_data._M_finish ==
                        right_most_path_occurrence.super__Vector_base<int,_std::allocator<int>_>.
                        _M_impl.super__Vector_impl_data._M_end_of_storage) {
                      std::vector<int,std::allocator<int>>::_M_realloc_insert<int_const&>
                                ((vector<int,std::allocator<int>> *)&right_most_path_occurrence,
                                 (iterator)
                                 right_most_path_occurrence.
                                 super__Vector_base<int,_std::allocator<int>_>._M_impl.
                                 super__Vector_impl_data._M_finish,
                                 sequence_of_nodes.super__Vector_base<int,_std::allocator<int>_>.
                                 _M_impl.super__Vector_impl_data._M_start + *piVar24);
                    }
                    else {
                      *right_most_path_occurrence.super__Vector_base<int,_std::allocator<int>_>.
                       _M_impl.super__Vector_impl_data._M_finish =
                           sequence_of_nodes.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                           super__Vector_impl_data._M_start[*piVar24];
                      right_most_path_occurrence.super__Vector_base<int,_std::allocator<int>_>.
                      _M_impl.super__Vector_impl_data._M_finish =
                           right_most_path_occurrence.super__Vector_base<int,_std::allocator<int>_>.
                           _M_impl.super__Vector_impl_data._M_finish + 1;
                    }
                    uVar27 = uVar27 + 1;
                    lVar17 = lVar17 + 4;
                  }
                  piVar13 = right_most_path.super__Deque_base<int,_std::allocator<int>_>._M_impl.
                            super__Deque_impl_data._M_finish._M_cur;
                  if ((long)right_most_path.super__Deque_base<int,_std::allocator<int>_>._M_impl.
                            super__Deque_impl_data._M_finish._M_cur -
                      (long)right_most_path.super__Deque_base<int,_std::allocator<int>_>._M_impl.
                            super__Deque_impl_data._M_finish._M_first == 0) {
                    piVar13 = right_most_path.super__Deque_base<int,_std::allocator<int>_>._M_impl.
                              super__Deque_impl_data._M_finish._M_node[-1] + 0x80;
                  }
                  paVar10 = (pvVar31->
                            super__Vector_base<std::array<int,_10UL>,_std::allocator<std::array<int,_10UL>_>_>
                            )._M_impl.super__Vector_impl_data._M_finish;
                  if ((piVar13[-1] == paVar10[-1]._M_elems[0]) &&
                     (local_32c = paVar10[-1]._M_elems[1], local_32c < piVar13[-1])) {
                    uVar27 = 0;
                    if (uVar26 != 0) {
                      lVar25 = (long)right_most_path.super__Deque_base<int,_std::allocator<int>_>.
                                     _M_impl.super__Deque_impl_data._M_start._M_cur -
                               (long)right_most_path.super__Deque_base<int,_std::allocator<int>_>.
                                     _M_impl.super__Deque_impl_data._M_start._M_first;
                      lVar33 = lVar25 >> 2;
                      lVar17 = 0;
                      uVar27 = 0;
                      do {
                        uVar29 = lVar33 + uVar27;
                        if ((long)uVar29 < 0) {
                          uVar29 = (long)uVar29 >> 7;
LAB_001413a1:
                          piVar24 = (int *)((long)right_most_path.
                                                  super__Deque_base<int,_std::allocator<int>_>.
                                                  _M_impl.super__Deque_impl_data._M_start._M_node
                                                  [uVar29] + lVar25 + uVar29 * -0x200);
                        }
                        else {
                          if (0x7f < uVar29) {
                            uVar29 = uVar29 >> 7;
                            goto LAB_001413a1;
                          }
                          piVar24 = right_most_path.super__Deque_base<int,_std::allocator<int>_>.
                                    _M_impl.super__Deque_impl_data._M_start._M_cur + uVar27;
                        }
                        if (*piVar24 == local_32c) {
                          uVar27 = lVar17 >> 0x20;
                          goto LAB_001413e6;
                        }
                        uVar27 = uVar27 + 1;
                        lVar17 = lVar17 + 0x100000000;
                        lVar25 = lVar25 + 4;
                      } while (uVar27 < uVar26);
                      uVar27 = 0;
                    }
                  }
                  else {
                    uVar27 = 0;
                  }
LAB_001413e6:
                  lVar17 = ((long)right_most_path.super__Deque_base<int,_std::allocator<int>_>.
                                  _M_impl.super__Deque_impl_data._M_finish._M_cur -
                            (long)right_most_path.super__Deque_base<int,_std::allocator<int>_>.
                                  _M_impl.super__Deque_impl_data._M_finish._M_first >> 2) +
                           ((uVar22 - 1) +
                           (ulong)(right_most_path.super__Deque_base<int,_std::allocator<int>_>.
                                   _M_impl.super__Deque_impl_data._M_finish._M_node ==
                                  (_Map_pointer)0x0)) * 0x80;
                  if (uVar27 < (lVar32 + lVar17) - 1U) {
                    local_32c = right_most_path_occurrence.
                                super__Vector_base<int,_std::allocator<int>_>._M_impl.
                                super__Vector_impl_data._M_finish[-1];
                    do {
                      find_backward_edge_candidates
                                ((vector<std::array<int,_8UL>,_std::allocator<std::array<int,_8UL>_>_>
                                  *)&n_1_1,&adj_list,&adj_edge_info,local_32c,
                                 right_most_path_occurrence.
                                 super__Vector_base<int,_std::allocator<int>_>._M_impl.
                                 super__Vector_impl_data._M_start[uVar27],&real_ids_src,
                                 &real_ids_dst,&real_ids_dst_ind);
                      pvVar23 = (void *)CONCAT44(uStack_5c,n_1_1);
                      if (local_58 != pvVar23) {
                        lVar17 = 0x10;
                        uVar22 = 0;
                        do {
                          piVar13 = right_most_path.super__Deque_base<int,_std::allocator<int>_>.
                                    _M_impl.super__Deque_impl_data._M_finish._M_cur;
                          if (right_most_path.super__Deque_base<int,_std::allocator<int>_>._M_impl.
                              super__Deque_impl_data._M_finish._M_cur ==
                              right_most_path.super__Deque_base<int,_std::allocator<int>_>._M_impl.
                              super__Deque_impl_data._M_finish._M_first) {
                            piVar13 = right_most_path.super__Deque_base<int,_std::allocator<int>_>.
                                      _M_impl.super__Deque_impl_data._M_finish._M_node[-1] + 0x80;
                          }
                          uVar26 = ((long)right_most_path.
                                          super__Deque_base<int,_std::allocator<int>_>._M_impl.
                                          super__Deque_impl_data._M_start._M_cur -
                                    (long)right_most_path.
                                          super__Deque_base<int,_std::allocator<int>_>._M_impl.
                                          super__Deque_impl_data._M_start._M_first >> 2) + uVar27;
                          if ((long)uVar26 < 0) {
                            uVar29 = (long)uVar26 >> 7;
LAB_001414dd:
                            piVar19 = right_most_path.super__Deque_base<int,_std::allocator<int>_>.
                                      _M_impl.super__Deque_impl_data._M_start._M_node[uVar29] +
                                      uVar26 + uVar29 * -0x80;
                          }
                          else {
                            if (0x7f < uVar26) {
                              uVar29 = uVar26 >> 7;
                              goto LAB_001414dd;
                            }
                            piVar19 = right_most_path.super__Deque_base<int,_std::allocator<int>_>.
                                      _M_impl.super__Deque_impl_data._M_start._M_cur + uVar27;
                          }
                          puVar2 = (ulong *)((long)pvVar23 + lVar17 + -0x10);
                          _Stack_290._0_8_ = *puVar2;
                          _Stack_290._M_parent = (_Base_ptr)puVar2[1];
                          _Stack_290._M_left = *(_Base_ptr *)((long)pvVar23 + lVar17);
                          _Stack_290._M_right = (_Base_ptr)((long *)((long)pvVar23 + lVar17))[1];
                          local_270._M_impl.super__Rb_tree_header._M_header._M_color = _S_red;
                          local_270._M_impl.super__Rb_tree_header._M_header._M_parent =
                               (_Base_ptr)0x0;
                          local_270._M_impl.super__Rb_tree_header._M_header._M_left =
                               &local_270._M_impl.super__Rb_tree_header._M_header;
                          local_270._M_impl.super__Rb_tree_header._M_node_count = 0;
                          local_240._M_bucket_count = 1;
                          local_240._M_before_begin._M_nxt = (_Hash_node_base *)0x0;
                          local_240._M_element_count = 0;
                          local_240._M_rehash_policy._M_max_load_factor = 1.0;
                          local_240._M_rehash_policy._M_next_resize = 0;
                          local_240._M_single_bucket = (__node_base_ptr)0x0;
                          _n_1 = CONCAT44(*piVar19,piVar13[-1]);
                          local_270._M_impl.super__Rb_tree_header._M_header._M_right =
                               local_270._M_impl.super__Rb_tree_header._M_header._M_left;
                          local_240._M_buckets = &local_240._M_single_bucket;
                          iVar12 = std::
                                   _Rb_tree<dgrminer::children_candidate,_dgrminer::children_candidate,_std::_Identity<dgrminer::children_candidate>,_std::less<dgrminer::children_candidate>,_std::allocator<dgrminer::children_candidate>_>
                                   ::find(&__return_storage_ptr__->_M_t,(key_type *)&n_1);
                          if ((_Rb_tree_header *)iVar12._M_node == p_Var1) {
                            std::
                            _Rb_tree<int,int,std::_Identity<int>,std::less<int>,std::allocator<int>>
                            ::_M_insert_unique<int_const&>
                                      ((_Rb_tree<int,int,std::_Identity<int>,std::less<int>,std::allocator<int>>
                                        *)&local_270,&g_id);
                            if (new_measures) {
                              p_Var11 = (_Rb_tree<std::set<int,std::less<int>,std::allocator<int>>,std::set<int,std::less<int>,std::allocator<int>>,std::_Identity<std::set<int,std::less<int>,std::allocator<int>>>,std::less<std::set<int,std::less<int>,std::allocator<int>>>,std::allocator<std::set<int,std::less<int>,std::allocator<int>>>>
                                         *)std::__detail::
                                           _Map_base<int,_std::pair<const_int,_std::set<std::set<int,_std::less<int>,_std::allocator<int>_>,_std::less<std::set<int,_std::less<int>,_std::allocator<int>_>_>,_std::allocator<std::set<int,_std::less<int>,_std::allocator<int>_>_>_>_>,_std::allocator<std::pair<const_int,_std::set<std::set<int,_std::less<int>,_std::allocator<int>_>,_std::less<std::set<int,_std::less<int>,_std::allocator<int>_>_>,_std::allocator<std::set<int,_std::less<int>,_std::allocator<int>_>_>_>_>_>,_std::__detail::_Select1st,_std::equal_to<int>,_std::hash<int>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>,_true>
                                           ::operator[]((
                                                  _Map_base<int,_std::pair<const_int,_std::set<std::set<int,_std::less<int>,_std::allocator<int>_>,_std::less<std::set<int,_std::less<int>,_std::allocator<int>_>_>,_std::allocator<std::set<int,_std::less<int>,_std::allocator<int>_>_>_>_>,_std::allocator<std::pair<const_int,_std::set<std::set<int,_std::less<int>,_std::allocator<int>_>,_std::less<std::set<int,_std::less<int>,_std::allocator<int>_>_>,_std::allocator<std::set<int,_std::less<int>,_std::allocator<int>_>_>_>_>_>,_std::__detail::_Select1st,_std::equal_to<int>,_std::hash<int>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>,_true>
                                                  *)&local_240,&g_id);
                              std::
                              _Rb_tree<std::set<int,std::less<int>,std::allocator<int>>,std::set<int,std::less<int>,std::allocator<int>>,std::_Identity<std::set<int,std::less<int>,std::allocator<int>>>,std::less<std::set<int,std::less<int>,std::allocator<int>>>,std::allocator<std::set<int,std::less<int>,std::allocator<int>>>>
                              ::
                              _M_insert_unique<std::set<int,std::less<int>,std::allocator<int>>const&>
                                        (p_Var11,&pattern_occurrence_vertexes);
                            }
                            std::
                            _Rb_tree<dgrminer::children_candidate,dgrminer::children_candidate,std::_Identity<dgrminer::children_candidate>,std::less<dgrminer::children_candidate>,std::allocator<dgrminer::children_candidate>>
                            ::_M_insert_unique<dgrminer::children_candidate_const&>
                                      ((_Rb_tree<dgrminer::children_candidate,dgrminer::children_candidate,std::_Identity<dgrminer::children_candidate>,std::less<dgrminer::children_candidate>,std::allocator<dgrminer::children_candidate>>
                                        *)__return_storage_ptr__,(children_candidate *)&n_1);
                          }
                          else {
                            std::
                            _Rb_tree<int,int,std::_Identity<int>,std::less<int>,std::allocator<int>>
                            ::_M_insert_unique<int_const&>
                                      ((_Rb_tree<int,int,std::_Identity<int>,std::less<int>,std::allocator<int>>
                                        *)&iVar12._M_node[2]._M_parent,&g_id);
                            if (new_measures) {
                              p_Var11 = (_Rb_tree<std::set<int,std::less<int>,std::allocator<int>>,std::set<int,std::less<int>,std::allocator<int>>,std::_Identity<std::set<int,std::less<int>,std::allocator<int>>>,std::less<std::set<int,std::less<int>,std::allocator<int>>>,std::allocator<std::set<int,std::less<int>,std::allocator<int>>>>
                                         *)std::__detail::
                                           _Map_base<int,_std::pair<const_int,_std::set<std::set<int,_std::less<int>,_std::allocator<int>_>,_std::less<std::set<int,_std::less<int>,_std::allocator<int>_>_>,_std::allocator<std::set<int,_std::less<int>,_std::allocator<int>_>_>_>_>,_std::allocator<std::pair<const_int,_std::set<std::set<int,_std::less<int>,_std::allocator<int>_>,_std::less<std::set<int,_std::less<int>,_std::allocator<int>_>_>,_std::allocator<std::set<int,_std::less<int>,_std::allocator<int>_>_>_>_>_>,_std::__detail::_Select1st,_std::equal_to<int>,_std::hash<int>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>,_true>
                                           ::operator[]((
                                                  _Map_base<int,_std::pair<const_int,_std::set<std::set<int,_std::less<int>,_std::allocator<int>_>,_std::less<std::set<int,_std::less<int>,_std::allocator<int>_>_>,_std::allocator<std::set<int,_std::less<int>,_std::allocator<int>_>_>_>_>,_std::allocator<std::pair<const_int,_std::set<std::set<int,_std::less<int>,_std::allocator<int>_>,_std::less<std::set<int,_std::less<int>,_std::allocator<int>_>_>,_std::allocator<std::set<int,_std::less<int>,_std::allocator<int>_>_>_>_>_>,_std::__detail::_Select1st,_std::equal_to<int>,_std::hash<int>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>,_true>
                                                  *)&iVar12._M_node[3]._M_right,&g_id);
                              std::
                              _Rb_tree<std::set<int,std::less<int>,std::allocator<int>>,std::set<int,std::less<int>,std::allocator<int>>,std::_Identity<std::set<int,std::less<int>,std::allocator<int>>>,std::less<std::set<int,std::less<int>,std::allocator<int>>>,std::allocator<std::set<int,std::less<int>,std::allocator<int>>>>
                              ::
                              _M_insert_unique<std::set<int,std::less<int>,std::allocator<int>>const&>
                                        (p_Var11,&pattern_occurrence_vertexes);
                            }
                          }
                          std::
                          _Hashtable<int,_std::pair<const_int,_std::set<std::set<int,_std::less<int>,_std::allocator<int>_>,_std::less<std::set<int,_std::less<int>,_std::allocator<int>_>_>,_std::allocator<std::set<int,_std::less<int>,_std::allocator<int>_>_>_>_>,_std::allocator<std::pair<const_int,_std::set<std::set<int,_std::less<int>,_std::allocator<int>_>,_std::less<std::set<int,_std::less<int>,_std::allocator<int>_>_>,_std::allocator<std::set<int,_std::less<int>,_std::allocator<int>_>_>_>_>_>,_std::__detail::_Select1st,_std::equal_to<int>,_std::hash<int>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>_>
                          ::~_Hashtable(&local_240);
                          std::
                          _Rb_tree<int,_int,_std::_Identity<int>,_std::less<int>,_std::allocator<int>_>
                          ::~_Rb_tree(&local_270);
                          uVar22 = uVar22 + 1;
                          pvVar23 = (void *)CONCAT44(uStack_5c,n_1_1);
                          lVar17 = lVar17 + 0x20;
                        } while (uVar22 < (ulong)((long)local_58 - (long)pvVar23 >> 5));
                      }
                      if (pvVar23 != (void *)0x0) {
                        operator_delete(pvVar23);
                      }
                      uVar27 = uVar27 + 1;
                      lVar17 = ((long)right_most_path.super__Deque_base<int,_std::allocator<int>_>.
                                      _M_impl.super__Deque_impl_data._M_finish._M_cur -
                                (long)right_most_path.super__Deque_base<int,_std::allocator<int>_>.
                                      _M_impl.super__Deque_impl_data._M_finish._M_first >> 2) +
                               ((((ulong)((long)right_most_path.
                                                super__Deque_base<int,_std::allocator<int>_>._M_impl
                                                .super__Deque_impl_data._M_finish._M_node -
                                         (long)right_most_path.
                                               super__Deque_base<int,_std::allocator<int>_>._M_impl.
                                               super__Deque_impl_data._M_start._M_node) >> 3) - 1) +
                               (ulong)(right_most_path.super__Deque_base<int,_std::allocator<int>_>.
                                       _M_impl.super__Deque_impl_data._M_finish._M_node ==
                                      (_Map_pointer)0x0)) * 0x80;
                      lVar32 = (long)right_most_path.super__Deque_base<int,_std::allocator<int>_>.
                                     _M_impl.super__Deque_impl_data._M_start._M_last -
                               (long)right_most_path.super__Deque_base<int,_std::allocator<int>_>.
                                     _M_impl.super__Deque_impl_data._M_start._M_cur >> 2;
                    } while (uVar27 < (lVar32 + lVar17) - 1U);
                    iVar16 = (int)lVar17 + (int)lVar32;
                  }
                  else {
                    iVar16 = (int)lVar17 + (int)lVar32;
                  }
                  if (-1 < (int)(iVar16 - 1U)) {
                    uVar27 = (ulong)(iVar16 - 1U);
                    do {
                      real_second_edge_ids.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                      super__Vector_impl_data._M_start = (pointer)0x0;
                      real_second_edge_ids.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                      super__Vector_impl_data._M_finish = (pointer)0x0;
                      real_second_edge_ids.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                      super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
                      find_forward_edge_candidates
                                (&edge_candidates_1,&adj_list,&adj_edge_info,
                                 right_most_path_occurrence.
                                 super__Vector_base<int,_std::allocator<int>_>._M_impl.
                                 super__Vector_impl_data._M_start[uVar27],&sequence_of_nodes,
                                 &real_second_edge_ids);
                      if (edge_candidates_1.
                          super__Vector_base<std::array<int,_8UL>,_std::allocator<std::array<int,_8UL>_>_>
                          ._M_impl.super__Vector_impl_data._M_finish !=
                          edge_candidates_1.
                          super__Vector_base<std::array<int,_8UL>,_std::allocator<std::array<int,_8UL>_>_>
                          ._M_impl.super__Vector_impl_data._M_start) {
                        lVar17 = 0;
                        uVar22 = 0;
                        do {
                          std::
                          _Rb_tree<int,_int,_std::_Identity<int>,_std::less<int>,_std::allocator<int>_>
                          ::_Rb_tree((_Rb_tree<int,_int,_std::_Identity<int>,_std::less<int>,_std::allocator<int>_>
                                      *)&n_1_1,&pattern_occurrence_vertexes._M_t);
                          std::
                          _Rb_tree<int,int,std::_Identity<int>,std::less<int>,std::allocator<int>>::
                          _M_insert_unique<int_const&>
                                    ((_Rb_tree<int,int,std::_Identity<int>,std::less<int>,std::allocator<int>>
                                      *)&n_1_1,
                                     right_most_path_occurrence.
                                     super__Vector_base<int,_std::allocator<int>_>._M_impl.
                                     super__Vector_impl_data._M_start + uVar27);
                          std::
                          _Rb_tree<int,int,std::_Identity<int>,std::less<int>,std::allocator<int>>::
                          _M_insert_unique<int_const&>
                                    ((_Rb_tree<int,int,std::_Identity<int>,std::less<int>,std::allocator<int>>
                                      *)&n_1_1,
                                     (int *)((long)real_second_edge_ids.
                                                   super__Vector_base<int,_std::allocator<int>_>.
                                                   _M_impl.super__Vector_impl_data._M_start + lVar17
                                            ));
                          uVar26 = ((long)right_most_path.
                                          super__Deque_base<int,_std::allocator<int>_>._M_impl.
                                          super__Deque_impl_data._M_start._M_cur -
                                    (long)right_most_path.
                                          super__Deque_base<int,_std::allocator<int>_>._M_impl.
                                          super__Deque_impl_data._M_start._M_first >> 2) + uVar27;
                          if ((long)uVar26 < 0) {
                            uVar29 = (long)uVar26 >> 7;
LAB_001417dd:
                            piVar13 = right_most_path.super__Deque_base<int,_std::allocator<int>_>.
                                      _M_impl.super__Deque_impl_data._M_start._M_node[uVar29] +
                                      uVar26 + uVar29 * -0x80;
                          }
                          else {
                            if (0x7f < uVar26) {
                              uVar29 = uVar26 >> 7;
                              goto LAB_001417dd;
                            }
                            piVar13 = right_most_path.super__Deque_base<int,_std::allocator<int>_>.
                                      _M_impl.super__Deque_impl_data._M_start._M_cur + uVar27;
                          }
                          piVar19 = right_most_path.super__Deque_base<int,_std::allocator<int>_>.
                                    _M_impl.super__Deque_impl_data._M_finish._M_cur;
                          if (right_most_path.super__Deque_base<int,_std::allocator<int>_>._M_impl.
                              super__Deque_impl_data._M_finish._M_cur ==
                              right_most_path.super__Deque_base<int,_std::allocator<int>_>._M_impl.
                              super__Deque_impl_data._M_finish._M_first) {
                            piVar19 = right_most_path.super__Deque_base<int,_std::allocator<int>_>.
                                      _M_impl.super__Deque_impl_data._M_finish._M_node[-1] + 0x80;
                          }
                          _Stack_290._0_8_ =
                               *(undefined8 *)
                                ((edge_candidates_1.
                                  super__Vector_base<std::array<int,_8UL>,_std::allocator<std::array<int,_8UL>_>_>
                                  ._M_impl.super__Vector_impl_data._M_start)->_M_elems + lVar17 * 2)
                          ;
                          _Stack_290._M_parent =
                               *(_Base_ptr *)
                                ((edge_candidates_1.
                                  super__Vector_base<std::array<int,_8UL>,_std::allocator<std::array<int,_8UL>_>_>
                                  ._M_impl.super__Vector_impl_data._M_start)->_M_elems + lVar17 * 2
                                + 2);
                          _Stack_290._M_left =
                               *(_Base_ptr *)
                                ((edge_candidates_1.
                                  super__Vector_base<std::array<int,_8UL>,_std::allocator<std::array<int,_8UL>_>_>
                                  ._M_impl.super__Vector_impl_data._M_start)->_M_elems +
                                lVar17 * 2 + 4);
                          _Stack_290._M_right =
                               *(_Base_ptr *)
                                ((edge_candidates_1.
                                  super__Vector_base<std::array<int,_8UL>,_std::allocator<std::array<int,_8UL>_>_>
                                  ._M_impl.super__Vector_impl_data._M_start)->_M_elems +
                                 lVar17 * 2 + 4 + 2);
                          local_270._M_impl.super__Rb_tree_header._M_header._M_color = _S_red;
                          local_270._M_impl.super__Rb_tree_header._M_header._M_parent =
                               (_Base_ptr)0x0;
                          local_270._M_impl.super__Rb_tree_header._M_header._M_left =
                               &local_270._M_impl.super__Rb_tree_header._M_header;
                          local_270._M_impl.super__Rb_tree_header._M_node_count = 0;
                          local_240._M_bucket_count = 1;
                          local_240._M_before_begin._M_nxt = (_Hash_node_base *)0x0;
                          local_240._M_element_count = 0;
                          local_240._M_rehash_policy._M_max_load_factor = 1.0;
                          local_240._M_rehash_policy._M_next_resize = 0;
                          local_240._M_single_bucket = (__node_base_ptr)0x0;
                          _n_1 = CONCAT44(piVar19[-1] + 1,*piVar13);
                          local_270._M_impl.super__Rb_tree_header._M_header._M_right =
                               local_270._M_impl.super__Rb_tree_header._M_header._M_left;
                          local_240._M_buckets = &local_240._M_single_bucket;
                          iVar12 = std::
                                   _Rb_tree<dgrminer::children_candidate,_dgrminer::children_candidate,_std::_Identity<dgrminer::children_candidate>,_std::less<dgrminer::children_candidate>,_std::allocator<dgrminer::children_candidate>_>
                                   ::find(&__return_storage_ptr__->_M_t,(key_type *)&n_1);
                          if ((_Rb_tree_header *)iVar12._M_node == p_Var1) {
                            std::
                            _Rb_tree<int,int,std::_Identity<int>,std::less<int>,std::allocator<int>>
                            ::_M_insert_unique<int_const&>
                                      ((_Rb_tree<int,int,std::_Identity<int>,std::less<int>,std::allocator<int>>
                                        *)&local_270,&g_id);
                            if (new_measures) {
                              p_Var11 = (_Rb_tree<std::set<int,std::less<int>,std::allocator<int>>,std::set<int,std::less<int>,std::allocator<int>>,std::_Identity<std::set<int,std::less<int>,std::allocator<int>>>,std::less<std::set<int,std::less<int>,std::allocator<int>>>,std::allocator<std::set<int,std::less<int>,std::allocator<int>>>>
                                         *)std::__detail::
                                           _Map_base<int,_std::pair<const_int,_std::set<std::set<int,_std::less<int>,_std::allocator<int>_>,_std::less<std::set<int,_std::less<int>,_std::allocator<int>_>_>,_std::allocator<std::set<int,_std::less<int>,_std::allocator<int>_>_>_>_>,_std::allocator<std::pair<const_int,_std::set<std::set<int,_std::less<int>,_std::allocator<int>_>,_std::less<std::set<int,_std::less<int>,_std::allocator<int>_>_>,_std::allocator<std::set<int,_std::less<int>,_std::allocator<int>_>_>_>_>_>,_std::__detail::_Select1st,_std::equal_to<int>,_std::hash<int>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>,_true>
                                           ::operator[]((
                                                  _Map_base<int,_std::pair<const_int,_std::set<std::set<int,_std::less<int>,_std::allocator<int>_>,_std::less<std::set<int,_std::less<int>,_std::allocator<int>_>_>,_std::allocator<std::set<int,_std::less<int>,_std::allocator<int>_>_>_>_>,_std::allocator<std::pair<const_int,_std::set<std::set<int,_std::less<int>,_std::allocator<int>_>,_std::less<std::set<int,_std::less<int>,_std::allocator<int>_>_>,_std::allocator<std::set<int,_std::less<int>,_std::allocator<int>_>_>_>_>_>,_std::__detail::_Select1st,_std::equal_to<int>,_std::hash<int>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>,_true>
                                                  *)&local_240,&g_id);
                              std::
                              _Rb_tree<std::set<int,std::less<int>,std::allocator<int>>,std::set<int,std::less<int>,std::allocator<int>>,std::_Identity<std::set<int,std::less<int>,std::allocator<int>>>,std::less<std::set<int,std::less<int>,std::allocator<int>>>,std::allocator<std::set<int,std::less<int>,std::allocator<int>>>>
                              ::
                              _M_insert_unique<std::set<int,std::less<int>,std::allocator<int>>const&>
                                        (p_Var11,(set<int,_std::less<int>,_std::allocator<int>_> *)
                                                 &n_1_1);
                            }
                            std::
                            _Rb_tree<dgrminer::children_candidate,dgrminer::children_candidate,std::_Identity<dgrminer::children_candidate>,std::less<dgrminer::children_candidate>,std::allocator<dgrminer::children_candidate>>
                            ::_M_insert_unique<dgrminer::children_candidate_const&>
                                      ((_Rb_tree<dgrminer::children_candidate,dgrminer::children_candidate,std::_Identity<dgrminer::children_candidate>,std::less<dgrminer::children_candidate>,std::allocator<dgrminer::children_candidate>>
                                        *)__return_storage_ptr__,(children_candidate *)&n_1);
                          }
                          else {
                            std::
                            _Rb_tree<int,int,std::_Identity<int>,std::less<int>,std::allocator<int>>
                            ::_M_insert_unique<int_const&>
                                      ((_Rb_tree<int,int,std::_Identity<int>,std::less<int>,std::allocator<int>>
                                        *)&iVar12._M_node[2]._M_parent,&g_id);
                            if (new_measures) {
                              p_Var11 = (_Rb_tree<std::set<int,std::less<int>,std::allocator<int>>,std::set<int,std::less<int>,std::allocator<int>>,std::_Identity<std::set<int,std::less<int>,std::allocator<int>>>,std::less<std::set<int,std::less<int>,std::allocator<int>>>,std::allocator<std::set<int,std::less<int>,std::allocator<int>>>>
                                         *)std::__detail::
                                           _Map_base<int,_std::pair<const_int,_std::set<std::set<int,_std::less<int>,_std::allocator<int>_>,_std::less<std::set<int,_std::less<int>,_std::allocator<int>_>_>,_std::allocator<std::set<int,_std::less<int>,_std::allocator<int>_>_>_>_>,_std::allocator<std::pair<const_int,_std::set<std::set<int,_std::less<int>,_std::allocator<int>_>,_std::less<std::set<int,_std::less<int>,_std::allocator<int>_>_>,_std::allocator<std::set<int,_std::less<int>,_std::allocator<int>_>_>_>_>_>,_std::__detail::_Select1st,_std::equal_to<int>,_std::hash<int>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>,_true>
                                           ::operator[]((
                                                  _Map_base<int,_std::pair<const_int,_std::set<std::set<int,_std::less<int>,_std::allocator<int>_>,_std::less<std::set<int,_std::less<int>,_std::allocator<int>_>_>,_std::allocator<std::set<int,_std::less<int>,_std::allocator<int>_>_>_>_>,_std::allocator<std::pair<const_int,_std::set<std::set<int,_std::less<int>,_std::allocator<int>_>,_std::less<std::set<int,_std::less<int>,_std::allocator<int>_>_>,_std::allocator<std::set<int,_std::less<int>,_std::allocator<int>_>_>_>_>_>,_std::__detail::_Select1st,_std::equal_to<int>,_std::hash<int>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>,_true>
                                                  *)&iVar12._M_node[3]._M_right,&g_id);
                              std::
                              _Rb_tree<std::set<int,std::less<int>,std::allocator<int>>,std::set<int,std::less<int>,std::allocator<int>>,std::_Identity<std::set<int,std::less<int>,std::allocator<int>>>,std::less<std::set<int,std::less<int>,std::allocator<int>>>,std::allocator<std::set<int,std::less<int>,std::allocator<int>>>>
                              ::
                              _M_insert_unique<std::set<int,std::less<int>,std::allocator<int>>const&>
                                        (p_Var11,(set<int,_std::less<int>,_std::allocator<int>_> *)
                                                 &n_1_1);
                            }
                          }
                          std::
                          _Hashtable<int,_std::pair<const_int,_std::set<std::set<int,_std::less<int>,_std::allocator<int>_>,_std::less<std::set<int,_std::less<int>,_std::allocator<int>_>_>,_std::allocator<std::set<int,_std::less<int>,_std::allocator<int>_>_>_>_>,_std::allocator<std::pair<const_int,_std::set<std::set<int,_std::less<int>,_std::allocator<int>_>,_std::less<std::set<int,_std::less<int>,_std::allocator<int>_>_>,_std::allocator<std::set<int,_std::less<int>,_std::allocator<int>_>_>_>_>_>,_std::__detail::_Select1st,_std::equal_to<int>,_std::hash<int>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>_>
                          ::~_Hashtable(&local_240);
                          std::
                          _Rb_tree<int,_int,_std::_Identity<int>,_std::less<int>,_std::allocator<int>_>
                          ::~_Rb_tree(&local_270);
                          std::
                          _Rb_tree<int,_int,_std::_Identity<int>,_std::less<int>,_std::allocator<int>_>
                          ::~_Rb_tree((_Rb_tree<int,_int,_std::_Identity<int>,_std::less<int>,_std::allocator<int>_>
                                       *)&n_1_1);
                          uVar22 = uVar22 + 1;
                          lVar17 = lVar17 + 4;
                        } while (uVar22 < (ulong)((long)edge_candidates_1.
                                                                                                                
                                                  super__Vector_base<std::array<int,_8UL>,_std::allocator<std::array<int,_8UL>_>_>
                                                  ._M_impl.super__Vector_impl_data._M_finish -
                                                  (long)edge_candidates_1.
                                                                                                                
                                                  super__Vector_base<std::array<int,_8UL>,_std::allocator<std::array<int,_8UL>_>_>
                                                  ._M_impl.super__Vector_impl_data._M_start >> 5));
                      }
                      if (edge_candidates_1.
                          super__Vector_base<std::array<int,_8UL>,_std::allocator<std::array<int,_8UL>_>_>
                          ._M_impl.super__Vector_impl_data._M_start != (pointer)0x0) {
                        operator_delete(edge_candidates_1.
                                        super__Vector_base<std::array<int,_8UL>,_std::allocator<std::array<int,_8UL>_>_>
                                        ._M_impl.super__Vector_impl_data._M_start);
                      }
                      if (real_second_edge_ids.super__Vector_base<int,_std::allocator<int>_>._M_impl
                          .super__Vector_impl_data._M_start != (pointer)0x0) {
                        operator_delete(real_second_edge_ids.
                                        super__Vector_base<int,_std::allocator<int>_>._M_impl.
                                        super__Vector_impl_data._M_start);
                      }
                      bVar6 = 0 < (long)uVar27;
                      uVar27 = uVar27 - 1;
                    } while (bVar6);
                  }
                  if (local_328 <
                      (ulong)((long)real_ids_src.super__Vector_base<int,_std::allocator<int>_>.
                                    _M_impl.super__Vector_impl_data._M_finish -
                              (long)real_ids_src.super__Vector_base<int,_std::allocator<int>_>.
                                    _M_impl.super__Vector_impl_data._M_start >> 2)) {
                    real_ids_src.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                    super__Vector_impl_data._M_start[local_328] = 0;
                    real_ids_dst.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                    super__Vector_impl_data._M_start[local_328] = 0;
                    real_ids_dst_ind.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                    super__Vector_impl_data._M_start[local_328] = 0;
                    real_ids_src_ind.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                    super__Vector_impl_data._M_start[local_328] = 0;
                  }
                  if (right_most_path_occurrence.super__Vector_base<int,_std::allocator<int>_>.
                      _M_impl.super__Vector_impl_data._M_start != (pointer)0x0) {
                    operator_delete(right_most_path_occurrence.
                                    super__Vector_base<int,_std::allocator<int>_>._M_impl.
                                    super__Vector_impl_data._M_start);
                  }
                  iVar16 = local_314 + -1;
                  std::_Rb_tree<int,_int,_std::_Identity<int>,_std::less<int>,_std::allocator<int>_>
                  ::~_Rb_tree(&pattern_occurrence_vertexes._M_t);
                }
                if (iVar16 != 0) {
                  lVar17 = (long)iVar16;
                  paVar10 = (local_320->
                            super__Vector_base<std::array<int,_10UL>,_std::allocator<std::array<int,_10UL>_>_>
                            )._M_impl.super__Vector_impl_data._M_start;
                  iVar28 = paVar10[lVar17]._M_elems[0];
                  iVar3 = paVar10[lVar17]._M_elems[1];
                  iVar4 = sequence_of_nodes.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                          super__Vector_impl_data._M_start[iVar28];
                  local_32c = iVar4;
                  local_314 = iVar16;
                  local_310 = lVar17;
                  if (iVar3 < iVar28) {
                    uVar27 = (ulong)sequence_of_edge_indices.
                                    super__Vector_base<int,_std::allocator<int>_>._M_impl.
                                    super__Vector_impl_data._M_start[lVar17];
                    piVar14 = adj_list.
                              super__Vector_base<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
                              ._M_impl.super__Vector_impl_data._M_start[iVar4].
                              super__Vector_base<int,_std::allocator<int>_>._M_impl.
                              super__Vector_impl_data._M_start;
                    if (uVar27 < (ulong)((long)adj_list.
                                               super__Vector_base<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
                                               ._M_impl.super__Vector_impl_data._M_start[iVar4].
                                               super__Vector_base<int,_std::allocator<int>_>._M_impl
                                               .super__Vector_impl_data._M_finish - (long)piVar14 >>
                                        2)) {
                      iVar16 = sequence_of_nodes.super__Vector_base<int,_std::allocator<int>_>.
                               _M_impl.super__Vector_impl_data._M_start[iVar3];
                      do {
                        local_328 = uVar27;
                        if (piVar14[uVar27] == iVar16) {
                          bVar6 = is_adj_info_equal_to_pattern_edge
                                            (adj_edge_info.
                                             super__Vector_base<std::vector<std::array<int,_8UL>,_std::allocator<std::array<int,_8UL>_>_>,_std::allocator<std::vector<std::array<int,_8UL>,_std::allocator<std::array<int,_8UL>_>_>_>_>
                                             ._M_impl.super__Vector_impl_data._M_start[iVar4].
                                             super__Vector_base<std::array<int,_8UL>,_std::allocator<std::array<int,_8UL>_>_>
                                             ._M_impl.super__Vector_impl_data._M_start + uVar27,
                                             (local_320->
                                             super__Vector_base<std::array<int,_10UL>,_std::allocator<std::array<int,_10UL>_>_>
                                             )._M_impl.super__Vector_impl_data._M_start + lVar17,
                                             true);
                          if (bVar6) {
                            if ((long)real_ids_src.super__Vector_base<int,_std::allocator<int>_>.
                                      _M_impl.super__Vector_impl_data._M_finish -
                                (long)real_ids_src.super__Vector_base<int,_std::allocator<int>_>.
                                      _M_impl.super__Vector_impl_data._M_start == 0) {
LAB_00141e96:
                              real_ids_src.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                              super__Vector_impl_data._M_start[local_310] = local_32c;
                              real_ids_dst.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                              super__Vector_impl_data._M_start[local_310] = iVar16;
                              real_ids_dst_ind.super__Vector_base<int,_std::allocator<int>_>._M_impl
                              .super__Vector_impl_data._M_start[local_310] = (int)local_328;
                              piVar14 = adj_list.
                                        super__Vector_base<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
                                        ._M_impl.super__Vector_impl_data._M_start[iVar16].
                                        super__Vector_base<int,_std::allocator<int>_>._M_impl.
                                        super__Vector_impl_data._M_start;
                              if (adj_list.
                                  super__Vector_base<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
                                  ._M_impl.super__Vector_impl_data._M_start[iVar16].
                                  super__Vector_base<int,_std::allocator<int>_>._M_impl.
                                  super__Vector_impl_data._M_finish == piVar14) goto LAB_00141f3b;
                              lVar32 = 0;
                              uVar27 = 0;
                              pvVar15 = adj_list.
                                        super__Vector_base<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
                                        ._M_impl.super__Vector_impl_data._M_start;
                              goto LAB_00141ec7;
                            }
                            lVar32 = (long)real_ids_src.
                                           super__Vector_base<int,_std::allocator<int>_>._M_impl.
                                           super__Vector_impl_data._M_finish -
                                     (long)real_ids_src.
                                           super__Vector_base<int,_std::allocator<int>_>._M_impl.
                                           super__Vector_impl_data._M_start >> 2;
                            lVar25 = 0;
                            while( true ) {
                              bVar6 = false;
                              bVar34 = false;
                              if ((real_ids_src.super__Vector_base<int,_std::allocator<int>_>.
                                   _M_impl.super__Vector_impl_data._M_start[lVar25] == local_32c) &&
                                 (real_ids_dst.super__Vector_base<int,_std::allocator<int>_>._M_impl
                                  .super__Vector_impl_data._M_start[lVar25] == iVar16)) {
                                bVar34 = local_328 ==
                                         (long)real_ids_dst_ind.
                                               super__Vector_base<int,_std::allocator<int>_>._M_impl
                                               .super__Vector_impl_data._M_start[lVar25];
                              }
                              if ((real_ids_src.super__Vector_base<int,_std::allocator<int>_>.
                                   _M_impl.super__Vector_impl_data._M_start[lVar25] == iVar16) &&
                                 (real_ids_dst.super__Vector_base<int,_std::allocator<int>_>._M_impl
                                  .super__Vector_impl_data._M_start[lVar25] == local_32c)) {
                                bVar6 = local_328 ==
                                        (long)real_ids_src_ind.
                                              super__Vector_base<int,_std::allocator<int>_>._M_impl.
                                              super__Vector_impl_data._M_start[lVar25];
                              }
                              if (bVar6 || bVar34) break;
                              lVar25 = lVar25 + 1;
                              if (lVar32 + (ulong)(lVar32 == 0) == lVar25) goto LAB_00141e96;
                            }
                          }
                        }
                        uVar27 = local_328 + 1;
                        piVar14 = adj_list.
                                  super__Vector_base<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
                                  ._M_impl.super__Vector_impl_data._M_start[iVar4].
                                  super__Vector_base<int,_std::allocator<int>_>._M_impl.
                                  super__Vector_impl_data._M_start;
                      } while (uVar27 < (ulong)((long)adj_list.
                                                  super__Vector_base<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
                                                  ._M_impl.super__Vector_impl_data._M_start[iVar4].
                                                  super__Vector_base<int,_std::allocator<int>_>.
                                                  _M_impl.super__Vector_impl_data._M_finish -
                                                (long)piVar14 >> 2));
                    }
                  }
                  else {
                    uVar27 = (ulong)sequence_of_edge_indices.
                                    super__Vector_base<int,_std::allocator<int>_>._M_impl.
                                    super__Vector_impl_data._M_start[lVar17];
                    if (uVar27 < (ulong)((long)adj_list.
                                               super__Vector_base<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
                                               ._M_impl.super__Vector_impl_data._M_start[iVar4].
                                               super__Vector_base<int,_std::allocator<int>_>._M_impl
                                               .super__Vector_impl_data._M_finish -
                                         (long)adj_list.
                                               super__Vector_base<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
                                               ._M_impl.super__Vector_impl_data._M_start[iVar4].
                                               super__Vector_base<int,_std::allocator<int>_>._M_impl
                                               .super__Vector_impl_data._M_start >> 2)) {
                      do {
                        bVar6 = is_adj_info_equal_to_pattern_edge
                                          (adj_edge_info.
                                           super__Vector_base<std::vector<std::array<int,_8UL>,_std::allocator<std::array<int,_8UL>_>_>,_std::allocator<std::vector<std::array<int,_8UL>,_std::allocator<std::array<int,_8UL>_>_>_>_>
                                           ._M_impl.super__Vector_impl_data._M_start[iVar4].
                                           super__Vector_base<std::array<int,_8UL>,_std::allocator<std::array<int,_8UL>_>_>
                                           ._M_impl.super__Vector_impl_data._M_start + uVar27,
                                           (local_320->
                                           super__Vector_base<std::array<int,_10UL>,_std::allocator<std::array<int,_10UL>_>_>
                                           )._M_impl.super__Vector_impl_data._M_start + lVar17,true)
                        ;
                        piVar14 = adj_list.
                                  super__Vector_base<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
                                  ._M_impl.super__Vector_impl_data._M_start[iVar4].
                                  super__Vector_base<int,_std::allocator<int>_>._M_impl.
                                  super__Vector_impl_data._M_start;
                        if (bVar6) {
                          iVar16 = piVar14[uVar27];
                          local_328 = CONCAT44(local_328._4_4_,iVar16);
                          if ((long)real_ids_src.super__Vector_base<int,_std::allocator<int>_>.
                                    _M_impl.super__Vector_impl_data._M_finish -
                              (long)real_ids_src.super__Vector_base<int,_std::allocator<int>_>.
                                    _M_impl.super__Vector_impl_data._M_start == 0) {
LAB_00141d90:
                            real_ids_src.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                            super__Vector_impl_data._M_start[local_310] = local_32c;
                            real_ids_dst.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                            super__Vector_impl_data._M_start[local_310] = iVar16;
                            iVar28 = (int)uVar27;
                            real_ids_dst_ind.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                            super__Vector_impl_data._M_start[local_310] = iVar28;
                            piVar14 = adj_list.
                                      super__Vector_base<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
                                      ._M_impl.super__Vector_impl_data._M_start[iVar16].
                                      super__Vector_base<int,_std::allocator<int>_>._M_impl.
                                      super__Vector_impl_data._M_start;
                            if (adj_list.
                                super__Vector_base<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
                                ._M_impl.super__Vector_impl_data._M_start[iVar16].
                                super__Vector_base<int,_std::allocator<int>_>._M_impl.
                                super__Vector_impl_data._M_finish == piVar14) goto LAB_00141e55;
                            lVar32 = 0;
                            uVar27 = 0;
                            pvVar15 = adj_list.
                                      super__Vector_base<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
                                      ._M_impl.super__Vector_impl_data._M_start;
                            goto LAB_00141dcc;
                          }
                          lVar32 = (long)real_ids_src.super__Vector_base<int,_std::allocator<int>_>.
                                         _M_impl.super__Vector_impl_data._M_finish -
                                   (long)real_ids_src.super__Vector_base<int,_std::allocator<int>_>.
                                         _M_impl.super__Vector_impl_data._M_start >> 2;
                          lVar25 = 0;
                          while( true ) {
                            bVar6 = false;
                            bVar34 = false;
                            if ((real_ids_src.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                                 super__Vector_impl_data._M_start[lVar25] == local_32c) &&
                               (real_ids_dst.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                                super__Vector_impl_data._M_start[lVar25] == iVar16)) {
                              bVar34 = uVar27 == (long)real_ids_dst_ind.
                                                       super__Vector_base<int,_std::allocator<int>_>
                                                       ._M_impl.super__Vector_impl_data._M_start
                                                       [lVar25];
                            }
                            if ((real_ids_src.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                                 super__Vector_impl_data._M_start[lVar25] == iVar16) &&
                               (real_ids_dst.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                                super__Vector_impl_data._M_start[lVar25] == local_32c)) {
                              bVar6 = uVar27 == (long)real_ids_src_ind.
                                                      super__Vector_base<int,_std::allocator<int>_>.
                                                      _M_impl.super__Vector_impl_data._M_start
                                                      [lVar25];
                            }
                            if (bVar6 || bVar34) break;
                            lVar25 = lVar25 + 1;
                            if (lVar32 + (ulong)(lVar32 == 0) == lVar25) goto LAB_00141d90;
                          }
                        }
                        uVar27 = uVar27 + 1;
                      } while (uVar27 < (ulong)((long)adj_list.
                                                  super__Vector_base<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
                                                  ._M_impl.super__Vector_impl_data._M_start[iVar4].
                                                  super__Vector_base<int,_std::allocator<int>_>.
                                                  _M_impl.super__Vector_impl_data._M_finish -
                                                (long)piVar14 >> 2));
                    }
                  }
                  iVar28 = 0;
                  sequence_of_edge_indices.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                  super__Vector_impl_data._M_start[local_310] = 0;
                  real_ids_src.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                  super__Vector_impl_data._M_start[local_310] = 0;
                  real_ids_dst.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                  super__Vector_impl_data._M_start[local_310] = 0;
                  real_ids_dst_ind.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                  super__Vector_impl_data._M_start[local_310] = 0;
                  iVar16 = -1;
                  pvVar20 = &real_ids_src_ind;
                  goto LAB_00141f55;
                }
                if (sequence_of_edge_indices.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                    super__Vector_impl_data._M_start != (pointer)0x0) {
                  operator_delete(sequence_of_edge_indices.
                                  super__Vector_base<int,_std::allocator<int>_>._M_impl.
                                  super__Vector_impl_data._M_start);
                }
                if (sequence_of_nodes.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                    super__Vector_impl_data._M_start != (pointer)0x0) {
                  operator_delete(sequence_of_nodes.super__Vector_base<int,_std::allocator<int>_>.
                                  _M_impl.super__Vector_impl_data._M_start);
                }
              }
              uVar8 = uVar8 + 1;
              pvVar15 = adj_list.
                        super__Vector_base<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
                        ._M_impl.super__Vector_impl_data._M_finish;
              pvVar21 = adj_list.
                        super__Vector_base<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
                        ._M_impl.super__Vector_impl_data._M_start;
            } while (uVar8 < (ulong)((long)adj_list.
                                           super__Vector_base<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
                                           ._M_impl.super__Vector_impl_data._M_start[uVar30].
                                           super__Vector_base<int,_std::allocator<int>_>._M_impl.
                                           super__Vector_impl_data._M_finish -
                                     (long)adj_list.
                                           super__Vector_base<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
                                           ._M_impl.super__Vector_impl_data._M_start[uVar30].
                                           super__Vector_base<int,_std::allocator<int>_>._M_impl.
                                           super__Vector_impl_data._M_start >> 2));
          }
          uVar30 = uVar30 + 1;
        } while (uVar30 < (ulong)(((long)pvVar15 - (long)pvVar21 >> 3) * -0x5555555555555555));
      }
      if (real_ids_src_ind.super__Vector_base<int,_std::allocator<int>_>._M_impl.
          super__Vector_impl_data._M_start != (pointer)0x0) {
        operator_delete(real_ids_src_ind.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                        super__Vector_impl_data._M_start);
      }
      pvVar31 = local_320;
      if (real_ids_dst_ind.super__Vector_base<int,_std::allocator<int>_>._M_impl.
          super__Vector_impl_data._M_start != (pointer)0x0) {
        operator_delete(real_ids_dst_ind.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                        super__Vector_impl_data._M_start);
      }
      if (real_ids_dst.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data
          ._M_start != (pointer)0x0) {
        operator_delete(real_ids_dst.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                        super__Vector_impl_data._M_start);
      }
      if (real_ids_src.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data
          ._M_start != (pointer)0x0) {
        operator_delete(real_ids_src.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                        super__Vector_impl_data._M_start);
      }
      std::
      vector<std::vector<std::array<int,_8UL>,_std::allocator<std::array<int,_8UL>_>_>,_std::allocator<std::vector<std::array<int,_8UL>,_std::allocator<std::array<int,_8UL>_>_>_>_>
      ::~vector(&adj_edge_info);
      std::
      vector<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
      ::~vector(&adj_list);
      piVar7 = piVar7 + 1;
    } while (piVar7 != piVar5);
  }
  std::_Deque_base<int,_std::allocator<int>_>::~_Deque_base
            (&right_most_path.super__Deque_base<int,_std::allocator<int>_>);
  return __return_storage_ptr__;
LAB_00141dcc:
  do {
    if (piVar14[uVar27] == local_32c) {
      flipAdjacencyInfo((array<int,_8UL> *)
                        ((long)(adj_edge_info.
                                super__Vector_base<std::vector<std::array<int,_8UL>,_std::allocator<std::array<int,_8UL>_>_>,_std::allocator<std::vector<std::array<int,_8UL>,_std::allocator<std::array<int,_8UL>_>_>_>_>
                                ._M_impl.super__Vector_impl_data._M_start[iVar16].
                                super__Vector_base<std::array<int,_8UL>,_std::allocator<std::array<int,_8UL>_>_>
                                ._M_impl.super__Vector_impl_data._M_start)->_M_elems + lVar32));
      bVar6 = is_adj_info_equal_to_pattern_edge
                        ((array<int,_8UL> *)&n_1,
                         (local_320->
                         super__Vector_base<std::array<int,_10UL>,_std::allocator<std::array<int,_10UL>_>_>
                         )._M_impl.super__Vector_impl_data._M_start + lVar17,true);
      pvVar15 = adj_list.
                super__Vector_base<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
                ._M_impl.super__Vector_impl_data._M_start;
      if (bVar6) {
        real_ids_src_ind.super__Vector_base<int,_std::allocator<int>_>._M_impl.
        super__Vector_impl_data._M_start[local_310] = (int)uVar27;
        break;
      }
    }
    uVar27 = uVar27 + 1;
    piVar14 = pvVar15[iVar16].super__Vector_base<int,_std::allocator<int>_>._M_impl.
              super__Vector_impl_data._M_start;
    lVar32 = lVar32 + 0x20;
  } while (uVar27 < (ulong)((long)pvVar15[iVar16].super__Vector_base<int,_std::allocator<int>_>.
                                  _M_impl.super__Vector_impl_data._M_finish - (long)piVar14 >> 2));
LAB_00141e55:
  sequence_of_nodes.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
  _M_start[iVar3] = (int)local_328;
  goto LAB_00141f50;
LAB_00141ec7:
  do {
    if (piVar14[uVar27] == local_32c) {
      flipAdjacencyInfo((array<int,_8UL> *)
                        ((long)(adj_edge_info.
                                super__Vector_base<std::vector<std::array<int,_8UL>,_std::allocator<std::array<int,_8UL>_>_>,_std::allocator<std::vector<std::array<int,_8UL>,_std::allocator<std::array<int,_8UL>_>_>_>_>
                                ._M_impl.super__Vector_impl_data._M_start[iVar16].
                                super__Vector_base<std::array<int,_8UL>,_std::allocator<std::array<int,_8UL>_>_>
                                ._M_impl.super__Vector_impl_data._M_start)->_M_elems + lVar32));
      bVar6 = is_adj_info_equal_to_pattern_edge
                        ((array<int,_8UL> *)&n_1,
                         (local_320->
                         super__Vector_base<std::array<int,_10UL>,_std::allocator<std::array<int,_10UL>_>_>
                         )._M_impl.super__Vector_impl_data._M_start + lVar17,true);
      pvVar15 = adj_list.
                super__Vector_base<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
                ._M_impl.super__Vector_impl_data._M_start;
      if (bVar6) {
        real_ids_src_ind.super__Vector_base<int,_std::allocator<int>_>._M_impl.
        super__Vector_impl_data._M_start[local_310] = (int)uVar27;
        break;
      }
    }
    uVar27 = uVar27 + 1;
    piVar14 = pvVar15[iVar16].super__Vector_base<int,_std::allocator<int>_>._M_impl.
              super__Vector_impl_data._M_start;
    lVar32 = lVar32 + 0x20;
  } while (uVar27 < (ulong)((long)pvVar15[iVar16].super__Vector_base<int,_std::allocator<int>_>.
                                  _M_impl.super__Vector_impl_data._M_finish - (long)piVar14 >> 2));
LAB_00141f3b:
  iVar28 = (int)local_328;
LAB_00141f50:
  iVar28 = iVar28 + 1;
  pvVar20 = &sequence_of_edge_indices;
  iVar16 = 1;
LAB_00141f55:
  (pvVar20->super__Vector_base<int,_std::allocator<int>_>)._M_impl.super__Vector_impl_data._M_start
  [local_310] = iVar28;
  iVar16 = local_314 + iVar16;
  goto LAB_00140f63;
}

Assistant:

std::set<children_candidate> enumerate(std::vector<AdjacencyListCrate> &adjacency_lists, std::vector<int> &graph_ids,
                                           std::vector<std::array<int, PAT___SIZE>> &pattern_edge_list,
                                           std::vector<std::set<int>> &nodes_occupied_by_antecedent,
                                           std::vector<std::set<int>> &edges_occupied_by_antecedent, bool new_measures,
										   std::unordered_map<int, std::set<std::set<int>>> &multiple_pattern_occurrences,
										   std::unordered_map<int, std::set<std::set<int>>> &multiple_antecedent_occurrences)
	{
        // this functions is used for finding children candidates (return value)
        // adjacency_lists - adjacency list for each graph
        // graph_ids - ids of snapshots with the pattern
        // pattern_edge_list - pattern whose children are to be searched for
        // nodes_occupied_by_antecedent - (output parameter)
        // edges_occupied_by_antecedent - (output parameter)

        // here will be the result:
		std::set<children_candidate> children_candidates;

        // right-most path used for candidate generation (similarly as in gSpan)
		std::deque<int> right_most_path = find_rightmost_path(pattern_edge_list);

		// use maximum node id as a limit of number of nodes (used later)
		int number_of_nodes_in_pattern_edge_list = 0;
		for (size_t i = 0; i < pattern_edge_list.size(); i++) {
			if (number_of_nodes_in_pattern_edge_list < pattern_edge_list[i][1]) number_of_nodes_in_pattern_edge_list = pattern_edge_list[i][1];
		}
		number_of_nodes_in_pattern_edge_list++;

		// initialize nodes_occupied_by_antecedent and edges_occupied_by_antecedent vectors
		for (int i = 0; i < adjacency_lists.size(); i++) {
			nodes_occupied_by_antecedent.push_back(std::set<int>());
			edges_occupied_by_antecedent.push_back(std::set<int>());
		}

		// find occurrences in each graph
		for (int g_id : graph_ids)
		{
            // get the adjacency list (and also edge info) for the graph currently being processed
			std::vector<std::vector<int>> adj_list = adjacency_lists[g_id].adjacencyList;
			std::vector<std::vector<std::array<int, 8>>> adj_edge_info = adjacency_lists[g_id].adjacencyEdgeInfo;

			// these two vectors save src and dst vertices (their IDs) which correspond to real occurrences of the src and dst vertices of the pattern
            // i.e. it is mapping from pattern vertex ids to vertex ids in adjacency list
			std::vector<int> real_ids_src(pattern_edge_list.size(), 0);
			std::vector<int> real_ids_dst(pattern_edge_list.size(), 0);
			std::vector<int> real_ids_dst_ind(pattern_edge_list.size(), 0);
			std::vector<int> real_ids_src_ind(pattern_edge_list.size(), 0);


			int index_in_pattern_edge_list = 0;  // which element of pattern_edge_list are we currently processing

			// find occurrences in the current adj_list
            // begin by going through all edges in the adjacency list of the current graph:
			for (size_t u = 0; u < adj_list.size(); u++)
			{
				for (size_t v = 0; v < adj_list[u].size(); v++)
				{
                    // check whether the current edge in the adjacency list is equal to the current edge pattern:
					if (is_adj_info_equal_to_pattern_edge(adj_edge_info[u][v], pattern_edge_list[index_in_pattern_edge_list], true)) {
						// we found the first edge from pattern_edge_list in the adjacency list

						// which SRC and DST vertex ids (form adjacency list) were used:
						real_ids_src[0] = u;
						real_ids_dst[0] = adj_list[u][v];
                        // under which index can we find DST in the list edges going from SRC:
						real_ids_dst_ind[0] = v;
                        // and also the opposite information (under which index can we find SRC in the list of edges going from DST):
						for (size_t i = 0; i < adj_list[real_ids_dst[0]].size(); i++)
						{
							if (adj_list[real_ids_dst[0]][i] == u && is_adj_info_equal_to_pattern_edge(flipAdjacencyInfo(adj_edge_info[real_ids_dst[0]][i]), pattern_edge_list[index_in_pattern_edge_list], true))
							{
								real_ids_src_ind[0] = i;
								break;
							}
						}

						// initialize the helping variables and vectors
						// here we have the real IDs of vertices 0, 1, 2, ... from the pattern (i.e. mapping of pattern vertex ID i to real vertex ID in adjacency list can be found under index i)
						std::vector<int> sequence_of_nodes(number_of_nodes_in_pattern_edge_list, 0);
						// first edge is always forward from 0 to 1:
						sequence_of_nodes[0] = u;
						sequence_of_nodes[1] = adj_list[u][v];

                        // for each edge from pattern_edge_list, we store the index of lastly processed neighbor of the relevant node (i.e. index in adj_list[src])
						// it is used for backtracking: if we backtrack we continue from that index and not from zero.
						std::vector<int> sequence_of_edge_indices(pattern_edge_list.size(), 0);
						sequence_of_edge_indices[index_in_pattern_edge_list] = v;
						index_in_pattern_edge_list++;

						// do depth first search
						while (true) {
							// if we found the occurrence of the whole pattern:
							if (index_in_pattern_edge_list >= pattern_edge_list.size())
							{
								// save antecedent nodes and edges (i.e. those that are not addition changes) to edges_occupied_by_antecedent and edges_occupied_by_antecedent
								// (used for anomalies)
								for (int i = 0; i < pattern_edge_list.size(); i++) {
									int n_1 = real_ids_src[i];
									int n_2 = real_ids_dst_ind[i];

									// all elements of the frequent pattern should be occupied
									nodes_occupied_by_antecedent[g_id].insert(n_1);
									nodes_occupied_by_antecedent[g_id].insert(real_ids_dst[i]);
									edges_occupied_by_antecedent[g_id].insert(adj_edge_info[n_1][n_2][ADJ_INFO_ID]);
								}

							  	std::set<int> pattern_occurrence_vertexes;

							  	// save pattern occurrence and antecedent occurrence in order to properly calculate new measures
							  	if (new_measures) {
								  	std::set<int> antecedent_vertexes;
								  	for (int i = 0; i < pattern_edge_list.size(); ++i) {
									  	int n_1 = real_ids_src[i];

									  	pattern_occurrence_vertexes.insert(n_1);
									  	pattern_occurrence_vertexes.insert(real_ids_dst[i]);

									  	if (pattern_edge_list[i][PAT_SRC_CHANGETIME] != 0) {
											antecedent_vertexes.insert(n_1);
										}

									  	if (pattern_edge_list[i][PAT_DST_CHANGETIME] != 0) {
											antecedent_vertexes.insert(real_ids_dst[i]);
										}
									}

								  	multiple_pattern_occurrences[g_id].insert(pattern_occurrence_vertexes);
								  	multiple_antecedent_occurrences[g_id].insert(antecedent_vertexes);
								}

								std::vector<int> right_most_path_occurrence;
								for (size_t i = 0; i < right_most_path.size(); i++)
								{
									right_most_path_occurrence.push_back(sequence_of_nodes[right_most_path[i]]);
								}

								// generate all children (i.e. generate all edges which can be appended to the base pattern(pattern_edge_list)) and their occurrence

								// first, generate the backward edges (candidates):
								int right_most_vertex = right_most_path_occurrence.back();

								int backward_starting_ind = 0;
								if (right_most_path.back() == pattern_edge_list.back()[PAT_SRC_ID] && pattern_edge_list.back()[PAT_SRC_ID] > pattern_edge_list.back()[PAT_DST_ID])
								{
									// if the last edge in edge_list is a backward edge from the current RMP, add only edges with greater code
									for (size_t i = 0; i < right_most_path.size(); i++)
									{
										if (right_most_path[i] == pattern_edge_list.back()[PAT_DST_ID])
										{
											backward_starting_ind = i;
											break;
										}
									}
								}

								for (int i = backward_starting_ind; i < right_most_path.size() - 1; i++)
								{
									std::vector<std::array<int, 8>> edge_candidates = find_backward_edge_candidates(adj_list, adj_edge_info,
										right_most_vertex, right_most_path_occurrence[i],
										real_ids_src, real_ids_dst, real_ids_dst_ind);

									// save the edge_candidates (i,j must be appended)
									for (int j = 0; j < edge_candidates.size(); j++)
									{
										// save all children candidates
										std::array<int, 10> e_cand = { right_most_path.back(), right_most_path[i],
											edge_candidates[j][0], edge_candidates[j][1], edge_candidates[j][2], edge_candidates[j][3], edge_candidates[j][4],
											edge_candidates[j][5], edge_candidates[j][6], edge_candidates[j][7] };

										children_candidate cc;
										cc.elements = e_cand;
										// does not use edge ID when searching for the edge (we care only about the edge itself and its graph ids = occurrences)
										auto it = children_candidates.find(cc);

										if (it != std::end(children_candidates))
										{
											(it->occurrences).insert(g_id);

											if (new_measures) {
											  	it->multiple_occurrences[g_id].insert(pattern_occurrence_vertexes);
											}
										}
										else {
											cc.occurrences.insert(g_id);

											if (new_measures) {
											  	cc.multiple_occurrences[g_id].insert(pattern_occurrence_vertexes);
											}

										  	children_candidates.insert(cc);
										}
									}
								}

								// forward candidates:
								for (int i = right_most_path.size() - 1; i >= 0; i--)
								{
								  	std::vector<int> real_second_edge_ids;
								  	// realne id1 right_most_path_occurrence[i]
									std::vector<std::array<int, 8>> edge_candidates = find_forward_edge_candidates(adj_list, adj_edge_info,
										right_most_path_occurrence[i], sequence_of_nodes, real_second_edge_ids);

									for (int j = 0; j < edge_candidates.size(); j++)
									{
									  	std::set<int> child_occurrence_vertexes = pattern_occurrence_vertexes;
									  	child_occurrence_vertexes.insert(right_most_path_occurrence[i]);
									  	child_occurrence_vertexes.insert(real_second_edge_ids[j]);

										std::array<int, 10> e_cand = { right_most_path[i], right_most_path.back() + 1,
											edge_candidates[j][0], edge_candidates[j][1], edge_candidates[j][2], edge_candidates[j][3], edge_candidates[j][4],
											edge_candidates[j][5], edge_candidates[j][6], edge_candidates[j][7] };


										children_candidate cc;
										cc.elements = e_cand;
										// does not use edge ID when searching for the edge (we care only about the edge itself and its graph ids = occurrences)
										auto it = children_candidates.find(cc);


										if (it != std::end(children_candidates))
										{
											(it->occurrences).insert(g_id);

											if (new_measures) {
											  	it->multiple_occurrences[g_id].insert(child_occurrence_vertexes);
											}
										}
										else
										{
											cc.occurrences.insert(g_id);

										  	if (new_measures) {
												cc.multiple_occurrences[g_id].insert(child_occurrence_vertexes);
											}

											children_candidates.insert(cc);
										}
									}
								}

								// and backtrack
								if (index_in_pattern_edge_list < real_ids_src.size())
								{
									real_ids_src[index_in_pattern_edge_list] = 0;
									real_ids_dst[index_in_pattern_edge_list] = 0;
									real_ids_dst_ind[index_in_pattern_edge_list] = 0;
									real_ids_src_ind[index_in_pattern_edge_list] = 0;

								}
								index_in_pattern_edge_list--;

							} // if (current_index_in_edge_list >= pattern_edge_list.size()) // (if we found the occurrence of the whole pattern)

							// if we backtracked down to 1, it means that we tried all possibilities from this starting point in the given adjacency list
							if (index_in_pattern_edge_list == 0)
							{
								break;
							}

							// traverse (i.e. try to match the rest of the pattern with respect to the selected starting position in adjacency list):
							// try to find the occurrence of this pattern edge:
							int i = pattern_edge_list[index_in_pattern_edge_list][0];
							int j = pattern_edge_list[index_in_pattern_edge_list][1];

                            // check whether the edge is forward or backward
							if (i > j)
							{
								// backward edge;
								// we already have both vertices (real ids from adjacency list) in sequence_of_nodes, so get them:
								int src = sequence_of_nodes[i];
								int dst = sequence_of_nodes[j];
								// find the first index of an edge from "src" to "dst" and save the index into sequence_of_edge_indices
								bool should_backtrack = true;
								for (size_t edge_ind = sequence_of_edge_indices[index_in_pattern_edge_list]; edge_ind < adj_list[src].size(); edge_ind++)
								{
									// if we found the appropriate edge (don't use edge ID for matching):
									if (adj_list[src][edge_ind] == dst && is_adj_info_equal_to_pattern_edge(adj_edge_info[src][edge_ind], pattern_edge_list[index_in_pattern_edge_list], true))
									{
										// there can be only one edge which exactly matches
										// check if that edge is already there (occupied by traversal):
										bool is_already_there = false;
										for (size_t k = 0; k < real_ids_src.size(); k++)
										{
											if ((real_ids_src[k] == src && real_ids_dst[k] == dst && real_ids_dst_ind[k] == edge_ind)
												| (real_ids_src[k] == dst && real_ids_dst[k] == src && real_ids_src_ind[k] == edge_ind))
											{
												is_already_there = true;
												break;
											}
										}

										if (!is_already_there)
										{
											should_backtrack = false;
                                            // store the positions
											real_ids_src[index_in_pattern_edge_list] = src;
											real_ids_dst[index_in_pattern_edge_list] = dst;
											real_ids_dst_ind[index_in_pattern_edge_list] = edge_ind;
											for (size_t i = 0; i < adj_list[dst].size(); i++)
											{
												if (adj_list[dst][i] == src && is_adj_info_equal_to_pattern_edge(flipAdjacencyInfo(adj_edge_info[dst][i]), pattern_edge_list[index_in_pattern_edge_list], true))
												{
													real_ids_src_ind[index_in_pattern_edge_list] = i;
													break;
												}
											}

											sequence_of_edge_indices[index_in_pattern_edge_list] = edge_ind + 1;
											index_in_pattern_edge_list++;

											break;
										}

									}
								}

								if (should_backtrack)
								{

									sequence_of_edge_indices[index_in_pattern_edge_list] = 0;



									real_ids_src[index_in_pattern_edge_list] = 0;
									real_ids_dst[index_in_pattern_edge_list] = 0;
									real_ids_dst_ind[index_in_pattern_edge_list] = 0;
									real_ids_src_ind[index_in_pattern_edge_list] = 0;

									index_in_pattern_edge_list--;
								}
							}
							else
							{
								// forward edge
								// "src" vertex is already known in this case
								int src = sequence_of_nodes[i];
								// (but we must find the appropriate "dst" vertex)
								bool should_backtrack = true;
								for (size_t edge_ind = sequence_of_edge_indices[index_in_pattern_edge_list]; edge_ind < adj_list[src].size(); edge_ind++)
								{
									if (is_adj_info_equal_to_pattern_edge(adj_edge_info[src][edge_ind], pattern_edge_list[index_in_pattern_edge_list], true))
									{
										int dst = adj_list[src][edge_ind];
										// check if that edge is already there:
										bool is_already_there = false;
										for (size_t k = 0; k < real_ids_src.size(); k++)
										{
											if ((real_ids_src[k] == src && real_ids_dst[k] == dst && real_ids_dst_ind[k] == edge_ind)
												| (real_ids_src[k] == dst && real_ids_dst[k] == src && real_ids_src_ind[k] == edge_ind))
											{
												is_already_there = true;
												break;
											}
										}
										if (!is_already_there)
										{
											should_backtrack = false;
											real_ids_src[index_in_pattern_edge_list] = src;
											real_ids_dst[index_in_pattern_edge_list] = dst;
											real_ids_dst_ind[index_in_pattern_edge_list] = edge_ind;

											for (size_t i = 0; i < adj_list[dst].size(); i++)
											{
												if (adj_list[dst][i] == src && is_adj_info_equal_to_pattern_edge(flipAdjacencyInfo(adj_edge_info[dst][i]), pattern_edge_list[index_in_pattern_edge_list], true))
												{
													real_ids_src_ind[index_in_pattern_edge_list] = i;
													break;
												}
											}

											sequence_of_nodes[j] = dst;
											sequence_of_edge_indices[index_in_pattern_edge_list] = edge_ind + 1;
											index_in_pattern_edge_list++;

											break;
										}
									}

								}

								if (should_backtrack)
								{
									sequence_of_edge_indices[index_in_pattern_edge_list] = 0;
									real_ids_src[index_in_pattern_edge_list] = 0;
									real_ids_dst[index_in_pattern_edge_list] = 0;
									real_ids_dst_ind[index_in_pattern_edge_list] = 0;
									real_ids_src_ind[index_in_pattern_edge_list] = 0;
									index_in_pattern_edge_list--;
								}
							}

						}

					} // if (is_adj_info_equal_to_pattern_edge(adj_edge_info[u][v], pattern_edge_list[current_index_in_edge_list], true))

				} // for (size_t v = 0; v < adj_list[u].size(); v++)
			} // for (size_t u = 0; u < adj_list.size(); u++)

		} // for (int g_id : graph_ids)

		return children_candidates;
	}